

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  BBox1f BVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  void *pvVar15;
  __int_type_conflict _Var16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  RayQueryContext *pRVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar78 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar93 [16];
  undefined1 auVar103 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar108 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 extraout_var [56];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float t1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar169;
  undefined1 auVar168 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar201;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar197 [32];
  float fVar202;
  float fVar207;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar206;
  undefined1 auVar200 [32];
  float fVar208;
  float fVar217;
  float fVar218;
  undefined1 auVar209 [16];
  float fVar219;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar220;
  float fVar222;
  float fVar223;
  undefined1 auVar215 [32];
  undefined1 auVar221 [16];
  float fVar224;
  float fVar239;
  float fVar240;
  vfloat4 b0;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar241;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar245;
  float fVar246;
  float fVar253;
  float fVar255;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar254;
  float fVar256;
  float fVar257;
  undefined1 auVar252 [32];
  float fVar258;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar273;
  float fVar274;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar275;
  undefined1 auVar272 [32];
  __m128 a;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  vfloat4 a0;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  float fVar298;
  float fVar305;
  float fVar306;
  vfloat4 a0_1;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar307;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar308;
  float fVar309;
  float fVar310;
  float in_register_0000151c;
  undefined1 auVar304 [32];
  float fVar311;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  float fVar317;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float in_register_0000159c;
  undefined1 auVar326 [64];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar332;
  float in_register_000015dc;
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  vfloat_impl<4> p00;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_4a8 [16];
  undefined1 (*local_498) [16];
  RayQueryContext *local_490;
  RTCFilterFunctionNArguments args;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  uint mask_stack [4];
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  vfloat_impl<4> p03;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar216 [32];
  undefined1 auVar325 [32];
  
  PVar11 = prim[1];
  uVar73 = (ulong)(byte)PVar11;
  auVar229 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar229 = vinsertps_avx(auVar229,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar210 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar210 = vinsertps_avx(auVar210,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar224 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar229 = vsubps_avx(auVar229,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar104._0_4_ = fVar224 * auVar229._0_4_;
  auVar104._4_4_ = fVar224 * auVar229._4_4_;
  auVar104._8_4_ = fVar224 * auVar229._8_4_;
  auVar104._12_4_ = fVar224 * auVar229._12_4_;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 10)));
  auVar209._0_4_ = fVar224 * auVar210._0_4_;
  auVar209._4_4_ = fVar224 * auVar210._4_4_;
  auVar209._8_4_ = fVar224 * auVar210._8_4_;
  auVar209._12_4_ = fVar224 * auVar210._12_4_;
  auVar94._16_16_ = auVar27;
  auVar94._0_16_ = auVar229;
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 10)));
  auVar154._16_16_ = auVar210;
  auVar154._0_16_ = auVar229;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar154);
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 10)));
  auVar164._16_16_ = auVar210;
  auVar164._0_16_ = auVar229;
  auVar20 = vcvtdq2ps_avx(auVar164);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 10)));
  auVar165._16_16_ = auVar210;
  auVar165._0_16_ = auVar229;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xc + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xc + 10)));
  auVar21 = vcvtdq2ps_avx(auVar165);
  auVar197._16_16_ = auVar210;
  auVar197._0_16_ = auVar229;
  auVar22 = vcvtdq2ps_avx(auVar197);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xd + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xd + 10)));
  auVar234._16_16_ = auVar210;
  auVar234._0_16_ = auVar229;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x12 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar234);
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x12 + 10)));
  auVar235._16_16_ = auVar210;
  auVar235._0_16_ = auVar229;
  auVar24 = vcvtdq2ps_avx(auVar235);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x13 + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x13 + 10)));
  auVar269._16_16_ = auVar210;
  auVar269._0_16_ = auVar229;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x14 + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x14 + 10)));
  auVar25 = vcvtdq2ps_avx(auVar269);
  auVar284._16_16_ = auVar210;
  auVar284._0_16_ = auVar229;
  auVar26 = vcvtdq2ps_avx(auVar284);
  auVar229 = vshufps_avx(auVar209,auVar209,0);
  auVar210 = vshufps_avx(auVar209,auVar209,0x55);
  auVar27 = vshufps_avx(auVar209,auVar209,0xaa);
  fVar224 = auVar27._0_4_;
  fVar188 = auVar27._4_4_;
  fVar239 = auVar27._8_4_;
  fVar201 = auVar27._12_4_;
  fVar240 = auVar210._0_4_;
  fVar207 = auVar210._4_4_;
  fVar241 = auVar210._8_4_;
  fVar202 = auVar210._12_4_;
  fVar242 = auVar229._0_4_;
  fVar203 = auVar229._4_4_;
  fVar243 = auVar229._8_4_;
  fVar204 = auVar229._12_4_;
  auVar304._0_4_ = fVar242 * auVar94._0_4_ + fVar240 * auVar19._0_4_ + fVar224 * auVar20._0_4_;
  auVar304._4_4_ = fVar203 * auVar94._4_4_ + fVar207 * auVar19._4_4_ + fVar188 * auVar20._4_4_;
  auVar304._8_4_ = fVar243 * auVar94._8_4_ + fVar241 * auVar19._8_4_ + fVar239 * auVar20._8_4_;
  auVar304._12_4_ = fVar204 * auVar94._12_4_ + fVar202 * auVar19._12_4_ + fVar201 * auVar20._12_4_;
  auVar304._16_4_ = fVar242 * auVar94._16_4_ + fVar240 * auVar19._16_4_ + fVar224 * auVar20._16_4_;
  auVar304._20_4_ = fVar203 * auVar94._20_4_ + fVar207 * auVar19._20_4_ + fVar188 * auVar20._20_4_;
  auVar304._24_4_ = fVar243 * auVar94._24_4_ + fVar241 * auVar19._24_4_ + fVar239 * auVar20._24_4_;
  auVar304._28_4_ = fVar202 + in_register_000015dc + in_register_0000151c;
  auVar295._0_4_ = fVar242 * auVar21._0_4_ + fVar240 * auVar22._0_4_ + auVar23._0_4_ * fVar224;
  auVar295._4_4_ = fVar203 * auVar21._4_4_ + fVar207 * auVar22._4_4_ + auVar23._4_4_ * fVar188;
  auVar295._8_4_ = fVar243 * auVar21._8_4_ + fVar241 * auVar22._8_4_ + auVar23._8_4_ * fVar239;
  auVar295._12_4_ = fVar204 * auVar21._12_4_ + fVar202 * auVar22._12_4_ + auVar23._12_4_ * fVar201;
  auVar295._16_4_ = fVar242 * auVar21._16_4_ + fVar240 * auVar22._16_4_ + auVar23._16_4_ * fVar224;
  auVar295._20_4_ = fVar203 * auVar21._20_4_ + fVar207 * auVar22._20_4_ + auVar23._20_4_ * fVar188;
  auVar295._24_4_ = fVar243 * auVar21._24_4_ + fVar241 * auVar22._24_4_ + auVar23._24_4_ * fVar239;
  auVar295._28_4_ = fVar202 + in_register_000015dc + in_register_0000159c;
  auVar215._0_4_ = fVar242 * auVar24._0_4_ + fVar240 * auVar25._0_4_ + auVar26._0_4_ * fVar224;
  auVar215._4_4_ = fVar203 * auVar24._4_4_ + fVar207 * auVar25._4_4_ + auVar26._4_4_ * fVar188;
  auVar215._8_4_ = fVar243 * auVar24._8_4_ + fVar241 * auVar25._8_4_ + auVar26._8_4_ * fVar239;
  auVar215._12_4_ = fVar204 * auVar24._12_4_ + fVar202 * auVar25._12_4_ + auVar26._12_4_ * fVar201;
  auVar215._16_4_ = fVar242 * auVar24._16_4_ + fVar240 * auVar25._16_4_ + auVar26._16_4_ * fVar224;
  auVar215._20_4_ = fVar203 * auVar24._20_4_ + fVar207 * auVar25._20_4_ + auVar26._20_4_ * fVar188;
  auVar215._24_4_ = fVar243 * auVar24._24_4_ + fVar241 * auVar25._24_4_ + auVar26._24_4_ * fVar239;
  auVar215._28_4_ = fVar204 + fVar202 + fVar201;
  auVar229 = vshufps_avx(auVar104,auVar104,0);
  auVar210 = vshufps_avx(auVar104,auVar104,0x55);
  auVar27 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar188 = auVar27._0_4_;
  fVar239 = auVar27._4_4_;
  fVar201 = auVar27._8_4_;
  fVar240 = auVar27._12_4_;
  fVar243 = auVar210._0_4_;
  fVar204 = auVar210._4_4_;
  fVar244 = auVar210._8_4_;
  fVar205 = auVar210._12_4_;
  fVar207 = auVar22._28_4_ + fVar240;
  fVar241 = auVar229._0_4_;
  fVar202 = auVar229._4_4_;
  fVar242 = auVar229._8_4_;
  fVar203 = auVar229._12_4_;
  fVar224 = auVar94._28_4_;
  auVar125._0_4_ = fVar241 * auVar94._0_4_ + fVar243 * auVar19._0_4_ + fVar188 * auVar20._0_4_;
  auVar125._4_4_ = fVar202 * auVar94._4_4_ + fVar204 * auVar19._4_4_ + fVar239 * auVar20._4_4_;
  auVar125._8_4_ = fVar242 * auVar94._8_4_ + fVar244 * auVar19._8_4_ + fVar201 * auVar20._8_4_;
  auVar125._12_4_ = fVar203 * auVar94._12_4_ + fVar205 * auVar19._12_4_ + fVar240 * auVar20._12_4_;
  auVar125._16_4_ = fVar241 * auVar94._16_4_ + fVar243 * auVar19._16_4_ + fVar188 * auVar20._16_4_;
  auVar125._20_4_ = fVar202 * auVar94._20_4_ + fVar204 * auVar19._20_4_ + fVar239 * auVar20._20_4_;
  auVar125._24_4_ = fVar242 * auVar94._24_4_ + fVar244 * auVar19._24_4_ + fVar201 * auVar20._24_4_;
  auVar125._28_4_ = fVar224 + auVar19._28_4_ + auVar20._28_4_;
  auVar155._0_4_ = fVar241 * auVar21._0_4_ + auVar23._0_4_ * fVar188 + fVar243 * auVar22._0_4_;
  auVar155._4_4_ = fVar202 * auVar21._4_4_ + auVar23._4_4_ * fVar239 + fVar204 * auVar22._4_4_;
  auVar155._8_4_ = fVar242 * auVar21._8_4_ + auVar23._8_4_ * fVar201 + fVar244 * auVar22._8_4_;
  auVar155._12_4_ = fVar203 * auVar21._12_4_ + auVar23._12_4_ * fVar240 + fVar205 * auVar22._12_4_;
  auVar155._16_4_ = fVar241 * auVar21._16_4_ + auVar23._16_4_ * fVar188 + fVar243 * auVar22._16_4_;
  auVar155._20_4_ = fVar202 * auVar21._20_4_ + auVar23._20_4_ * fVar239 + fVar204 * auVar22._20_4_;
  auVar155._24_4_ = fVar242 * auVar21._24_4_ + auVar23._24_4_ * fVar201 + fVar244 * auVar22._24_4_;
  auVar155._28_4_ = fVar224 + auVar23._28_4_ + auVar20._28_4_;
  auVar166._8_4_ = 0x7fffffff;
  auVar166._0_8_ = 0x7fffffff7fffffff;
  auVar166._12_4_ = 0x7fffffff;
  auVar166._16_4_ = 0x7fffffff;
  auVar166._20_4_ = 0x7fffffff;
  auVar166._24_4_ = 0x7fffffff;
  auVar166._28_4_ = 0x7fffffff;
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  auVar183._16_4_ = 0x219392ef;
  auVar183._20_4_ = 0x219392ef;
  auVar183._24_4_ = 0x219392ef;
  auVar183._28_4_ = 0x219392ef;
  auVar94 = vandps_avx(auVar304,auVar166);
  auVar94 = vcmpps_avx(auVar94,auVar183,1);
  auVar19 = vblendvps_avx(auVar304,auVar183,auVar94);
  auVar94 = vandps_avx(auVar295,auVar166);
  auVar94 = vcmpps_avx(auVar94,auVar183,1);
  auVar20 = vblendvps_avx(auVar295,auVar183,auVar94);
  auVar94 = vandps_avx(auVar215,auVar166);
  auVar94 = vcmpps_avx(auVar94,auVar183,1);
  auVar94 = vblendvps_avx(auVar215,auVar183,auVar94);
  auVar167._0_4_ = fVar241 * auVar24._0_4_ + fVar243 * auVar25._0_4_ + auVar26._0_4_ * fVar188;
  auVar167._4_4_ = fVar202 * auVar24._4_4_ + fVar204 * auVar25._4_4_ + auVar26._4_4_ * fVar239;
  auVar167._8_4_ = fVar242 * auVar24._8_4_ + fVar244 * auVar25._8_4_ + auVar26._8_4_ * fVar201;
  auVar167._12_4_ = fVar203 * auVar24._12_4_ + fVar205 * auVar25._12_4_ + auVar26._12_4_ * fVar240;
  auVar167._16_4_ = fVar241 * auVar24._16_4_ + fVar243 * auVar25._16_4_ + auVar26._16_4_ * fVar188;
  auVar167._20_4_ = fVar202 * auVar24._20_4_ + fVar204 * auVar25._20_4_ + auVar26._20_4_ * fVar239;
  auVar167._24_4_ = fVar242 * auVar24._24_4_ + fVar244 * auVar25._24_4_ + auVar26._24_4_ * fVar201;
  auVar167._28_4_ = fVar224 + fVar207;
  auVar21 = vrcpps_avx(auVar19);
  fVar224 = auVar21._0_4_;
  fVar239 = auVar21._4_4_;
  auVar22._4_4_ = auVar19._4_4_ * fVar239;
  auVar22._0_4_ = auVar19._0_4_ * fVar224;
  fVar240 = auVar21._8_4_;
  auVar22._8_4_ = auVar19._8_4_ * fVar240;
  fVar241 = auVar21._12_4_;
  auVar22._12_4_ = auVar19._12_4_ * fVar241;
  fVar242 = auVar21._16_4_;
  auVar22._16_4_ = auVar19._16_4_ * fVar242;
  fVar243 = auVar21._20_4_;
  auVar22._20_4_ = auVar19._20_4_ * fVar243;
  fVar244 = auVar21._24_4_;
  auVar22._24_4_ = auVar19._24_4_ * fVar244;
  auVar22._28_4_ = fVar207;
  auVar270._8_4_ = 0x3f800000;
  auVar270._0_8_ = 0x3f8000003f800000;
  auVar270._12_4_ = 0x3f800000;
  auVar270._16_4_ = 0x3f800000;
  auVar270._20_4_ = 0x3f800000;
  auVar270._24_4_ = 0x3f800000;
  auVar270._28_4_ = 0x3f800000;
  auVar22 = vsubps_avx(auVar270,auVar22);
  auVar19 = vrcpps_avx(auVar20);
  fVar224 = fVar224 + fVar224 * auVar22._0_4_;
  fVar239 = fVar239 + fVar239 * auVar22._4_4_;
  fVar240 = fVar240 + fVar240 * auVar22._8_4_;
  fVar241 = fVar241 + fVar241 * auVar22._12_4_;
  fVar242 = fVar242 + fVar242 * auVar22._16_4_;
  fVar243 = fVar243 + fVar243 * auVar22._20_4_;
  fVar244 = fVar244 + fVar244 * auVar22._24_4_;
  fVar188 = auVar19._0_4_;
  fVar201 = auVar19._4_4_;
  auVar23._4_4_ = auVar20._4_4_ * fVar201;
  auVar23._0_4_ = auVar20._0_4_ * fVar188;
  fVar207 = auVar19._8_4_;
  auVar23._8_4_ = auVar20._8_4_ * fVar207;
  fVar202 = auVar19._12_4_;
  auVar23._12_4_ = auVar20._12_4_ * fVar202;
  fVar203 = auVar19._16_4_;
  auVar23._16_4_ = auVar20._16_4_ * fVar203;
  fVar204 = auVar19._20_4_;
  auVar23._20_4_ = auVar20._20_4_ * fVar204;
  fVar205 = auVar19._24_4_;
  auVar23._24_4_ = auVar20._24_4_ * fVar205;
  auVar23._28_4_ = auVar21._28_4_;
  auVar19 = vsubps_avx(auVar270,auVar23);
  fVar188 = fVar188 + fVar188 * auVar19._0_4_;
  fVar201 = fVar201 + fVar201 * auVar19._4_4_;
  fVar207 = fVar207 + fVar207 * auVar19._8_4_;
  fVar202 = fVar202 + fVar202 * auVar19._12_4_;
  fVar203 = fVar203 + fVar203 * auVar19._16_4_;
  fVar204 = fVar204 + fVar204 * auVar19._20_4_;
  fVar205 = fVar205 + fVar205 * auVar19._24_4_;
  auVar19 = vrcpps_avx(auVar94);
  fVar208 = auVar19._0_4_;
  fVar217 = auVar19._4_4_;
  auVar20._4_4_ = fVar217 * auVar94._4_4_;
  auVar20._0_4_ = fVar208 * auVar94._0_4_;
  fVar218 = auVar19._8_4_;
  auVar20._8_4_ = fVar218 * auVar94._8_4_;
  fVar219 = auVar19._12_4_;
  auVar20._12_4_ = fVar219 * auVar94._12_4_;
  fVar220 = auVar19._16_4_;
  auVar20._16_4_ = fVar220 * auVar94._16_4_;
  fVar222 = auVar19._20_4_;
  auVar20._20_4_ = fVar222 * auVar94._20_4_;
  fVar223 = auVar19._24_4_;
  auVar20._24_4_ = fVar223 * auVar94._24_4_;
  auVar20._28_4_ = auVar94._28_4_;
  auVar94 = vsubps_avx(auVar270,auVar20);
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar229 = vpmovsxwd_avx(auVar229);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + uVar73 * 7 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar210);
  fVar208 = fVar208 + fVar208 * auVar94._0_4_;
  fVar217 = fVar217 + fVar217 * auVar94._4_4_;
  fVar218 = fVar218 + fVar218 * auVar94._8_4_;
  fVar219 = fVar219 + fVar219 * auVar94._12_4_;
  fVar220 = fVar220 + fVar220 * auVar94._16_4_;
  fVar222 = fVar222 + fVar222 * auVar94._20_4_;
  fVar223 = fVar223 + fVar223 * auVar94._24_4_;
  auVar95._16_16_ = auVar210;
  auVar95._0_16_ = auVar229;
  auVar94 = vcvtdq2ps_avx(auVar95);
  auVar94 = vsubps_avx(auVar94,auVar125);
  auVar75._0_4_ = fVar224 * auVar94._0_4_;
  auVar75._4_4_ = fVar239 * auVar94._4_4_;
  auVar75._8_4_ = fVar240 * auVar94._8_4_;
  auVar75._12_4_ = fVar241 * auVar94._12_4_;
  auVar21._16_4_ = fVar242 * auVar94._16_4_;
  auVar21._0_16_ = auVar75;
  auVar21._20_4_ = fVar243 * auVar94._20_4_;
  auVar21._24_4_ = fVar244 * auVar94._24_4_;
  auVar21._28_4_ = auVar94._28_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar229 = vpmovsxwd_avx(auVar27);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar73 * 9 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar4);
  auVar184._16_16_ = auVar210;
  auVar184._0_16_ = auVar229;
  auVar94 = vcvtdq2ps_avx(auVar184);
  auVar94 = vsubps_avx(auVar94,auVar125);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = *(ulong *)(prim + uVar73 * 0xe + 6);
  auVar229 = vpmovsxwd_avx(auVar290);
  auVar105._0_4_ = fVar224 * auVar94._0_4_;
  auVar105._4_4_ = fVar239 * auVar94._4_4_;
  auVar105._8_4_ = fVar240 * auVar94._8_4_;
  auVar105._12_4_ = fVar241 * auVar94._12_4_;
  auVar24._16_4_ = fVar242 * auVar94._16_4_;
  auVar24._0_16_ = auVar105;
  auVar24._20_4_ = fVar243 * auVar94._20_4_;
  auVar24._24_4_ = fVar244 * auVar94._24_4_;
  auVar24._28_4_ = auVar94._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar73 * 0xe + 0xe);
  auVar210 = vpmovsxwd_avx(auVar5);
  auVar185._16_16_ = auVar210;
  auVar185._0_16_ = auVar229;
  auVar94 = vcvtdq2ps_avx(auVar185);
  auVar94 = vsubps_avx(auVar94,auVar155);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar229 = vpmovsxwd_avx(auVar6);
  auVar170._0_4_ = fVar188 * auVar94._0_4_;
  auVar170._4_4_ = fVar201 * auVar94._4_4_;
  auVar170._8_4_ = fVar207 * auVar94._8_4_;
  auVar170._12_4_ = fVar202 * auVar94._12_4_;
  auVar25._16_4_ = fVar203 * auVar94._16_4_;
  auVar25._0_16_ = auVar170;
  auVar25._20_4_ = fVar204 * auVar94._20_4_;
  auVar25._24_4_ = fVar205 * auVar94._24_4_;
  auVar25._28_4_ = auVar94._28_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar7);
  auVar236._16_16_ = auVar210;
  auVar236._0_16_ = auVar229;
  auVar94 = vcvtdq2ps_avx(auVar236);
  auVar94 = vsubps_avx(auVar94,auVar155);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar73 * 0x15 + 6);
  auVar229 = vpmovsxwd_avx(auVar8);
  auVar133._0_4_ = fVar188 * auVar94._0_4_;
  auVar133._4_4_ = fVar201 * auVar94._4_4_;
  auVar133._8_4_ = fVar207 * auVar94._8_4_;
  auVar133._12_4_ = fVar202 * auVar94._12_4_;
  auVar26._16_4_ = fVar203 * auVar94._16_4_;
  auVar26._0_16_ = auVar133;
  auVar26._20_4_ = fVar204 * auVar94._20_4_;
  auVar26._24_4_ = fVar205 * auVar94._24_4_;
  auVar26._28_4_ = auVar94._28_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar73 * 0x15 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar9);
  auVar198._16_16_ = auVar210;
  auVar198._0_16_ = auVar229;
  auVar94 = vcvtdq2ps_avx(auVar198);
  auVar94 = vsubps_avx(auVar94,auVar167);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar229 = vpmovsxwd_avx(auVar10);
  auVar189._0_4_ = fVar208 * auVar94._0_4_;
  auVar189._4_4_ = fVar217 * auVar94._4_4_;
  auVar189._8_4_ = fVar218 * auVar94._8_4_;
  auVar189._12_4_ = fVar219 * auVar94._12_4_;
  auVar28._16_4_ = fVar220 * auVar94._16_4_;
  auVar28._0_16_ = auVar189;
  auVar28._20_4_ = fVar222 * auVar94._20_4_;
  auVar28._24_4_ = fVar223 * auVar94._24_4_;
  auVar28._28_4_ = auVar94._28_4_;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar263);
  auVar237._16_16_ = auVar210;
  auVar237._0_16_ = auVar229;
  auVar94 = vcvtdq2ps_avx(auVar237);
  auVar94 = vsubps_avx(auVar94,auVar167);
  auVar159._0_4_ = fVar208 * auVar94._0_4_;
  auVar159._4_4_ = fVar217 * auVar94._4_4_;
  auVar159._8_4_ = fVar218 * auVar94._8_4_;
  auVar159._12_4_ = fVar219 * auVar94._12_4_;
  auVar29._16_4_ = fVar220 * auVar94._16_4_;
  auVar29._0_16_ = auVar159;
  auVar29._20_4_ = fVar222 * auVar94._20_4_;
  auVar29._24_4_ = fVar223 * auVar94._24_4_;
  auVar29._28_4_ = auVar94._28_4_;
  auVar229 = vpminsd_avx(auVar21._16_16_,auVar24._16_16_);
  auVar210 = vpminsd_avx(auVar75,auVar105);
  auVar285._16_16_ = auVar229;
  auVar285._0_16_ = auVar210;
  auVar229 = vpminsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar210 = vpminsd_avx(auVar170,auVar133);
  auVar296._16_16_ = auVar229;
  auVar296._0_16_ = auVar210;
  auVar94 = vmaxps_avx(auVar285,auVar296);
  auVar229 = vpminsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar210 = vpminsd_avx(auVar189,auVar159);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar330._4_4_ = uVar2;
  auVar330._0_4_ = uVar2;
  auVar330._8_4_ = uVar2;
  auVar330._12_4_ = uVar2;
  auVar330._16_4_ = uVar2;
  auVar330._20_4_ = uVar2;
  auVar330._24_4_ = uVar2;
  auVar330._28_4_ = uVar2;
  auVar316._16_16_ = auVar229;
  auVar316._0_16_ = auVar210;
  auVar19 = vmaxps_avx(auVar316,auVar330);
  auVar94 = vmaxps_avx(auVar94,auVar19);
  local_1b8._4_4_ = auVar94._4_4_ * 0.99999964;
  local_1b8._0_4_ = auVar94._0_4_ * 0.99999964;
  local_1b8._8_4_ = auVar94._8_4_ * 0.99999964;
  local_1b8._12_4_ = auVar94._12_4_ * 0.99999964;
  local_1b8._16_4_ = auVar94._16_4_ * 0.99999964;
  local_1b8._20_4_ = auVar94._20_4_ * 0.99999964;
  local_1b8._24_4_ = auVar94._24_4_ * 0.99999964;
  local_1b8._28_4_ = auVar94._28_4_;
  auVar229 = vpmaxsd_avx(auVar21._16_16_,auVar24._16_16_);
  auVar210 = vpmaxsd_avx(auVar75,auVar105);
  auVar96._16_16_ = auVar229;
  auVar96._0_16_ = auVar210;
  auVar229 = vpmaxsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar210 = vpmaxsd_avx(auVar170,auVar133);
  auVar126._16_16_ = auVar229;
  auVar126._0_16_ = auVar210;
  auVar94 = vminps_avx(auVar96,auVar126);
  auVar229 = vpmaxsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar210 = vpmaxsd_avx(auVar189,auVar159);
  auVar127._16_16_ = auVar229;
  auVar127._0_16_ = auVar210;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar156._4_4_ = uVar2;
  auVar156._0_4_ = uVar2;
  auVar156._8_4_ = uVar2;
  auVar156._12_4_ = uVar2;
  auVar156._16_4_ = uVar2;
  auVar156._20_4_ = uVar2;
  auVar156._24_4_ = uVar2;
  auVar156._28_4_ = uVar2;
  auVar19 = vminps_avx(auVar127,auVar156);
  auVar94 = vminps_avx(auVar94,auVar19);
  auVar19._4_4_ = auVar94._4_4_ * 1.0000004;
  auVar19._0_4_ = auVar94._0_4_ * 1.0000004;
  auVar19._8_4_ = auVar94._8_4_ * 1.0000004;
  auVar19._12_4_ = auVar94._12_4_ * 1.0000004;
  auVar19._16_4_ = auVar94._16_4_ * 1.0000004;
  auVar19._20_4_ = auVar94._20_4_ * 1.0000004;
  auVar19._24_4_ = auVar94._24_4_ * 1.0000004;
  auVar19._28_4_ = auVar94._28_4_;
  auVar94 = vcmpps_avx(local_1b8,auVar19,2);
  auVar229 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar128._16_16_ = auVar229;
  auVar128._0_16_ = auVar229;
  auVar19 = vcvtdq2ps_avx(auVar128);
  auVar19 = vcmpps_avx(_DAT_01f7b060,auVar19,1);
  auVar94 = vandps_avx(auVar94,auVar19);
  uVar69 = vmovmskps_avx(auVar94);
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  local_498 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_490 = context;
LAB_009c5df4:
  pRVar68 = local_490;
  uVar73 = (ulong)uVar69;
  if (uVar73 == 0) {
    return;
  }
  lVar71 = 0;
  if (uVar73 != 0) {
    for (; (uVar69 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  uVar69 = *(uint *)(prim + 2);
  uVar12 = *(uint *)(prim + lVar71 * 4 + 6);
  pGVar13 = (context->scene->geometries).items[uVar69].ptr;
  uVar74 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar12);
  p_Var14 = pGVar13[1].intersectionFilterN;
  pvVar15 = pGVar13[2].userPtr;
  _Var16 = pGVar13[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar229 = *(undefined1 (*) [16])(_Var16 + uVar74 * (long)pvVar15);
  pfVar1 = (float *)(_Var16 + (uVar74 + 1) * (long)pvVar15);
  fVar224 = *pfVar1;
  fVar188 = pfVar1[1];
  fVar239 = pfVar1[2];
  fVar201 = pfVar1[3];
  pfVar1 = (float *)(_Var16 + (uVar74 + 2) * (long)pvVar15);
  fVar240 = *pfVar1;
  fVar207 = pfVar1[1];
  fVar241 = pfVar1[2];
  fVar202 = pfVar1[3];
  pfVar1 = (float *)(_Var16 + (long)pvVar15 * (uVar74 + 3));
  fVar242 = *pfVar1;
  fVar203 = pfVar1[1];
  fVar243 = pfVar1[2];
  fVar204 = pfVar1[3];
  uVar73 = uVar73 - 1 & uVar73;
  lVar71 = *(long *)&pGVar13[1].time_range.upper;
  pfVar1 = (float *)(lVar71 + (long)p_Var14 * uVar74);
  fVar244 = *pfVar1;
  fVar205 = pfVar1[1];
  fVar208 = pfVar1[2];
  fVar217 = pfVar1[3];
  pfVar1 = (float *)(lVar71 + (long)p_Var14 * (uVar74 + 1));
  fVar218 = *pfVar1;
  fVar219 = pfVar1[1];
  fVar220 = pfVar1[2];
  fVar222 = pfVar1[3];
  pfVar1 = (float *)(lVar71 + (long)p_Var14 * (uVar74 + 2));
  fVar223 = *pfVar1;
  fVar169 = pfVar1[1];
  fVar206 = pfVar1[2];
  fVar245 = pfVar1[3];
  lVar17 = 0;
  if (uVar73 != 0) {
    for (; (uVar73 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
    }
  }
  pfVar1 = (float *)(lVar71 + (long)p_Var14 * (uVar74 + 3));
  fVar246 = *pfVar1;
  fVar253 = pfVar1[1];
  fVar254 = pfVar1[2];
  fVar298 = pfVar1[3];
  if (((uVar73 != 0) && (uVar74 = uVar73 - 1 & uVar73, uVar74 != 0)) && (lVar71 = 0, uVar74 != 0)) {
    for (; (uVar74 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  auVar210 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar27 = vinsertps_avx(auVar210,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_5a8._0_4_ =
       fVar244 * 0.16666667 + fVar218 * 0.6666667 + fVar223 * 0.16666667 + fVar246 * 0.0;
  local_5a8._4_4_ =
       fVar205 * 0.16666667 + fVar219 * 0.6666667 + fVar169 * 0.16666667 + fVar253 * 0.0;
  fStack_5a0 = fVar208 * 0.16666667 + fVar220 * 0.6666667 + fVar206 * 0.16666667 + fVar254 * 0.0;
  fStack_59c = fVar217 * 0.16666667 + fVar222 * 0.6666667 + fVar245 * 0.16666667 + fVar298 * 0.0;
  auVar134._0_4_ = fVar223 * 0.5 + fVar246 * 0.0;
  auVar134._4_4_ = fVar169 * 0.5 + fVar253 * 0.0;
  auVar134._8_4_ = fVar206 * 0.5 + fVar254 * 0.0;
  auVar134._12_4_ = fVar245 * 0.5 + fVar298 * 0.0;
  auVar287._0_4_ = fVar218 * 0.0;
  auVar287._4_4_ = fVar219 * 0.0;
  auVar287._8_4_ = fVar220 * 0.0;
  auVar287._12_4_ = fVar222 * 0.0;
  auVar210 = vsubps_avx(auVar134,auVar287);
  auVar288._0_4_ = fVar244 * 0.5;
  auVar288._4_4_ = fVar205 * 0.5;
  auVar288._8_4_ = fVar208 * 0.5;
  auVar288._12_4_ = fVar217 * 0.5;
  auVar8 = vsubps_avx(auVar210,auVar288);
  fVar255 = auVar229._0_4_;
  fVar305 = auVar229._4_4_;
  fVar256 = auVar229._8_4_;
  fVar306 = auVar229._12_4_;
  auVar289._0_4_ = fVar255 * 0.16666667 + fVar224 * 0.6666667 + fVar240 * 0.16666667 + fVar242 * 0.0
  ;
  auVar289._4_4_ = fVar305 * 0.16666667 + fVar188 * 0.6666667 + fVar207 * 0.16666667 + fVar203 * 0.0
  ;
  auVar289._8_4_ = fVar256 * 0.16666667 + fVar239 * 0.6666667 + fVar241 * 0.16666667 + fVar243 * 0.0
  ;
  auVar289._12_4_ =
       fVar306 * 0.16666667 + fVar201 * 0.6666667 + fVar202 * 0.16666667 + fVar204 * 0.0;
  auVar299._0_4_ = fVar240 * 0.5 + fVar242 * 0.0;
  auVar299._4_4_ = fVar207 * 0.5 + fVar203 * 0.0;
  auVar299._8_4_ = fVar241 * 0.5 + fVar243 * 0.0;
  auVar299._12_4_ = fVar202 * 0.5 + fVar204 * 0.0;
  auVar312._0_4_ = fVar224 * 0.0;
  auVar312._4_4_ = fVar188 * 0.0;
  auVar312._8_4_ = fVar239 * 0.0;
  auVar312._12_4_ = fVar201 * 0.0;
  auVar229 = vsubps_avx(auVar299,auVar312);
  auVar313._0_4_ = fVar255 * 0.5;
  auVar313._4_4_ = fVar305 * 0.5;
  auVar313._8_4_ = fVar256 * 0.5;
  auVar313._12_4_ = fVar306 * 0.5;
  auVar290 = vsubps_avx(auVar229,auVar313);
  auVar318._0_4_ = fVar244 * 0.0;
  auVar318._4_4_ = fVar205 * 0.0;
  auVar318._8_4_ = fVar208 * 0.0;
  auVar318._12_4_ = fVar217 * 0.0;
  local_5c8._0_4_ =
       auVar318._0_4_ + fVar218 * 0.16666667 + fVar223 * 0.6666667 + fVar246 * 0.16666667;
  local_5c8._4_4_ =
       auVar318._4_4_ + fVar219 * 0.16666667 + fVar169 * 0.6666667 + fVar253 * 0.16666667;
  fStack_5c0 = auVar318._8_4_ + fVar220 * 0.16666667 + fVar206 * 0.6666667 + fVar254 * 0.16666667;
  fStack_5bc = auVar318._12_4_ + fVar222 * 0.16666667 + fVar245 * 0.6666667 + fVar298 * 0.16666667;
  auVar259._0_4_ = fVar223 * 0.0 + fVar246 * 0.5;
  auVar259._4_4_ = fVar169 * 0.0 + fVar253 * 0.5;
  auVar259._8_4_ = fVar206 * 0.0 + fVar254 * 0.5;
  auVar259._12_4_ = fVar245 * 0.0 + fVar298 * 0.5;
  auVar171._0_4_ = fVar218 * 0.5;
  auVar171._4_4_ = fVar219 * 0.5;
  auVar171._8_4_ = fVar220 * 0.5;
  auVar171._12_4_ = fVar222 * 0.5;
  auVar229 = vsubps_avx(auVar259,auVar171);
  auVar9 = vsubps_avx(auVar229,auVar318);
  auVar139._0_4_ = fVar255 * 0.0;
  auVar139._4_4_ = fVar305 * 0.0;
  auVar139._8_4_ = fVar256 * 0.0;
  auVar139._12_4_ = fVar306 * 0.0;
  auVar260._0_4_ =
       fVar224 * 0.16666667 + fVar240 * 0.6666667 + fVar242 * 0.16666667 + auVar139._0_4_;
  auVar260._4_4_ =
       fVar188 * 0.16666667 + fVar207 * 0.6666667 + fVar203 * 0.16666667 + auVar139._4_4_;
  auVar260._8_4_ =
       fVar239 * 0.16666667 + fVar241 * 0.6666667 + fVar243 * 0.16666667 + auVar139._8_4_;
  auVar260._12_4_ =
       fVar201 * 0.16666667 + fVar202 * 0.6666667 + fVar204 * 0.16666667 + auVar139._12_4_;
  auVar225._0_4_ = fVar242 * 0.5 + fVar240 * 0.0;
  auVar225._4_4_ = fVar203 * 0.5 + fVar207 * 0.0;
  auVar225._8_4_ = fVar243 * 0.5 + fVar241 * 0.0;
  auVar225._12_4_ = fVar204 * 0.5 + fVar202 * 0.0;
  auVar82._0_4_ = fVar224 * 0.5;
  auVar82._4_4_ = fVar188 * 0.5;
  auVar82._8_4_ = fVar239 * 0.5;
  auVar82._12_4_ = fVar201 * 0.5;
  auVar229 = vsubps_avx(auVar225,auVar82);
  auVar6 = vsubps_avx(auVar229,auVar139);
  auVar229 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar210 = vshufps_avx(auVar289,auVar289,0xc9);
  fVar223 = auVar8._0_4_;
  auVar226._0_4_ = fVar223 * auVar210._0_4_;
  fVar169 = auVar8._4_4_;
  auVar226._4_4_ = fVar169 * auVar210._4_4_;
  fVar206 = auVar8._8_4_;
  auVar226._8_4_ = fVar206 * auVar210._8_4_;
  fVar245 = auVar8._12_4_;
  auVar226._12_4_ = fVar245 * auVar210._12_4_;
  auVar247._0_4_ = auVar289._0_4_ * auVar229._0_4_;
  auVar247._4_4_ = auVar289._4_4_ * auVar229._4_4_;
  auVar247._8_4_ = auVar289._8_4_ * auVar229._8_4_;
  auVar247._12_4_ = auVar289._12_4_ * auVar229._12_4_;
  auVar210 = vsubps_avx(auVar247,auVar226);
  auVar4 = vshufps_avx(auVar210,auVar210,0xc9);
  auVar210 = vshufps_avx(auVar290,auVar290,0xc9);
  auVar227._0_4_ = fVar223 * auVar210._0_4_;
  auVar227._4_4_ = fVar169 * auVar210._4_4_;
  auVar227._8_4_ = fVar206 * auVar210._8_4_;
  auVar227._12_4_ = fVar245 * auVar210._12_4_;
  auVar190._0_4_ = auVar290._0_4_ * auVar229._0_4_;
  auVar190._4_4_ = auVar290._4_4_ * auVar229._4_4_;
  auVar190._8_4_ = auVar290._8_4_ * auVar229._8_4_;
  auVar190._12_4_ = auVar290._12_4_ * auVar229._12_4_;
  auVar229 = vsubps_avx(auVar190,auVar227);
  auVar290 = vshufps_avx(auVar229,auVar229,0xc9);
  auVar229 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar210 = vshufps_avx(auVar260,auVar260,0xc9);
  fVar218 = auVar9._0_4_;
  auVar153._0_4_ = fVar218 * auVar210._0_4_;
  fVar219 = auVar9._4_4_;
  auVar153._4_4_ = fVar219 * auVar210._4_4_;
  fVar220 = auVar9._8_4_;
  auVar153._8_4_ = fVar220 * auVar210._8_4_;
  fVar222 = auVar9._12_4_;
  auVar153._12_4_ = fVar222 * auVar210._12_4_;
  auVar261._0_4_ = auVar260._0_4_ * auVar229._0_4_;
  auVar261._4_4_ = auVar260._4_4_ * auVar229._4_4_;
  auVar261._8_4_ = auVar260._8_4_ * auVar229._8_4_;
  auVar261._12_4_ = auVar260._12_4_ * auVar229._12_4_;
  auVar210 = vsubps_avx(auVar261,auVar153);
  auVar5 = vshufps_avx(auVar210,auVar210,0xc9);
  auVar210 = vshufps_avx(auVar6,auVar6,0xc9);
  auVar262._0_4_ = auVar210._0_4_ * fVar218;
  auVar262._4_4_ = auVar210._4_4_ * fVar219;
  auVar262._8_4_ = auVar210._8_4_ * fVar220;
  auVar262._12_4_ = auVar210._12_4_ * fVar222;
  auVar111._0_4_ = auVar229._0_4_ * auVar6._0_4_;
  auVar111._4_4_ = auVar229._4_4_ * auVar6._4_4_;
  auVar111._8_4_ = auVar229._8_4_ * auVar6._8_4_;
  auVar111._12_4_ = auVar229._12_4_ * auVar6._12_4_;
  auVar229 = vdpps_avx(auVar4,auVar4,0x7f);
  auVar210 = vsubps_avx(auVar111,auVar262);
  auVar6 = vshufps_avx(auVar210,auVar210,0xc9);
  fVar240 = auVar229._0_4_;
  auVar263 = ZEXT416((uint)fVar240);
  auVar210 = vrsqrtss_avx(auVar263,auVar263);
  fVar224 = auVar210._0_4_;
  auVar210 = ZEXT416((uint)(fVar224 * 1.5 - fVar240 * 0.5 * fVar224 * fVar224 * fVar224));
  auVar7 = vshufps_avx(auVar210,auVar210,0);
  fVar224 = auVar4._0_4_ * auVar7._0_4_;
  fVar188 = auVar4._4_4_ * auVar7._4_4_;
  fVar239 = auVar4._8_4_ * auVar7._8_4_;
  fVar201 = auVar4._12_4_ * auVar7._12_4_;
  auVar210 = vdpps_avx(auVar4,auVar290,0x7f);
  auVar229 = vshufps_avx(auVar229,auVar229,0);
  auVar279._0_4_ = auVar290._0_4_ * auVar229._0_4_;
  auVar279._4_4_ = auVar290._4_4_ * auVar229._4_4_;
  auVar279._8_4_ = auVar290._8_4_ * auVar229._8_4_;
  auVar279._12_4_ = auVar290._12_4_ * auVar229._12_4_;
  auVar229 = vshufps_avx(auVar210,auVar210,0);
  auVar248._0_4_ = auVar4._0_4_ * auVar229._0_4_;
  auVar248._4_4_ = auVar4._4_4_ * auVar229._4_4_;
  auVar248._8_4_ = auVar4._8_4_ * auVar229._8_4_;
  auVar248._12_4_ = auVar4._12_4_ * auVar229._12_4_;
  auVar10 = vsubps_avx(auVar279,auVar248);
  auVar229 = vrcpss_avx(auVar263,auVar263);
  auVar229 = ZEXT416((uint)(auVar229._0_4_ * (2.0 - fVar240 * auVar229._0_4_)));
  auVar4 = vshufps_avx(auVar229,auVar229,0);
  auVar229 = vdpps_avx(auVar5,auVar5,0x7f);
  fVar240 = auVar229._0_4_;
  auVar263 = ZEXT416((uint)fVar240);
  auVar210 = vrsqrtss_avx(auVar263,auVar263);
  fVar207 = auVar210._0_4_;
  auVar210 = vdpps_avx(auVar5,auVar6,0x7f);
  auVar290 = ZEXT416((uint)(fVar207 * 1.5 - fVar240 * 0.5 * fVar207 * fVar207 * fVar207));
  auVar290 = vshufps_avx(auVar290,auVar290,0);
  fVar207 = auVar290._0_4_ * auVar5._0_4_;
  fVar241 = auVar290._4_4_ * auVar5._4_4_;
  fVar202 = auVar290._8_4_ * auVar5._8_4_;
  fVar242 = auVar290._12_4_ * auVar5._12_4_;
  auVar229 = vshufps_avx(auVar229,auVar229,0);
  auVar228._0_4_ = auVar229._0_4_ * auVar6._0_4_;
  auVar228._4_4_ = auVar229._4_4_ * auVar6._4_4_;
  auVar228._8_4_ = auVar229._8_4_ * auVar6._8_4_;
  auVar228._12_4_ = auVar229._12_4_ * auVar6._12_4_;
  auVar229 = vshufps_avx(auVar210,auVar210,0);
  auVar122._0_4_ = auVar229._0_4_ * auVar5._0_4_;
  auVar122._4_4_ = auVar229._4_4_ * auVar5._4_4_;
  auVar122._8_4_ = auVar229._8_4_ * auVar5._8_4_;
  auVar122._12_4_ = auVar229._12_4_ * auVar5._12_4_;
  auVar6 = vsubps_avx(auVar228,auVar122);
  auVar229 = vrcpss_avx(auVar263,auVar263);
  auVar229 = ZEXT416((uint)((2.0 - fVar240 * auVar229._0_4_) * auVar229._0_4_));
  auVar229 = vshufps_avx(auVar229,auVar229,0);
  auVar210 = vshufps_avx(_local_5a8,_local_5a8,0xff);
  auVar264._0_4_ = auVar210._0_4_ * fVar224;
  auVar264._4_4_ = auVar210._4_4_ * fVar188;
  auVar264._8_4_ = auVar210._8_4_ * fVar239;
  auVar264._12_4_ = auVar210._12_4_ * fVar201;
  auVar263 = vsubps_avx(_local_5a8,auVar264);
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  auVar221._0_4_ =
       auVar5._0_4_ * fVar224 + auVar7._0_4_ * auVar10._0_4_ * auVar4._0_4_ * auVar210._0_4_;
  auVar221._4_4_ =
       auVar5._4_4_ * fVar188 + auVar7._4_4_ * auVar10._4_4_ * auVar4._4_4_ * auVar210._4_4_;
  auVar221._8_4_ =
       auVar5._8_4_ * fVar239 + auVar7._8_4_ * auVar10._8_4_ * auVar4._8_4_ * auVar210._8_4_;
  auVar221._12_4_ =
       auVar5._12_4_ * fVar201 + auVar7._12_4_ * auVar10._12_4_ * auVar4._12_4_ * auVar210._12_4_;
  auVar5 = vsubps_avx(auVar8,auVar221);
  auVar300._0_4_ = auVar264._0_4_ + (float)local_5a8._0_4_;
  auVar300._4_4_ = auVar264._4_4_ + (float)local_5a8._4_4_;
  auVar300._8_4_ = auVar264._8_4_ + fStack_5a0;
  auVar300._12_4_ = auVar264._12_4_ + fStack_59c;
  auVar210 = vshufps_avx(_local_5c8,_local_5c8,0xff);
  auVar135._0_4_ = fVar207 * auVar210._0_4_;
  auVar135._4_4_ = fVar241 * auVar210._4_4_;
  auVar135._8_4_ = fVar202 * auVar210._8_4_;
  auVar135._12_4_ = fVar242 * auVar210._12_4_;
  auVar7 = vsubps_avx(_local_5c8,auVar135);
  auVar4 = vshufps_avx(auVar9,auVar9,0xff);
  auVar106._0_4_ =
       fVar207 * auVar4._0_4_ + auVar210._0_4_ * auVar290._0_4_ * auVar6._0_4_ * auVar229._0_4_;
  auVar106._4_4_ =
       fVar241 * auVar4._4_4_ + auVar210._4_4_ * auVar290._4_4_ * auVar6._4_4_ * auVar229._4_4_;
  auVar106._8_4_ =
       fVar202 * auVar4._8_4_ + auVar210._8_4_ * auVar290._8_4_ * auVar6._8_4_ * auVar229._8_4_;
  auVar106._12_4_ =
       fVar242 * auVar4._12_4_ + auVar210._12_4_ * auVar290._12_4_ * auVar6._12_4_ * auVar229._12_4_
  ;
  auVar290 = vsubps_avx(auVar9,auVar106);
  auVar319._0_4_ = (float)local_5c8._0_4_ + auVar135._0_4_;
  auVar319._4_4_ = (float)local_5c8._4_4_ + auVar135._4_4_;
  auVar319._8_4_ = fStack_5c0 + auVar135._8_4_;
  auVar319._12_4_ = fStack_5bc + auVar135._12_4_;
  auVar280._0_4_ = auVar263._0_4_ + auVar5._0_4_ * 0.33333334;
  auVar280._4_4_ = auVar263._4_4_ + auVar5._4_4_ * 0.33333334;
  auVar280._8_4_ = auVar263._8_4_ + auVar5._8_4_ * 0.33333334;
  auVar280._12_4_ = auVar263._12_4_ + auVar5._12_4_ * 0.33333334;
  auVar8 = vsubps_avx(auVar263,auVar27);
  auVar210 = vmovsldup_avx(auVar8);
  auVar229 = vmovshdup_avx(auVar8);
  auVar4 = vshufps_avx(auVar8,auVar8,0xaa);
  fVar224 = pre->ray_space[k].vx.field_0.m128[0];
  fVar188 = pre->ray_space[k].vx.field_0.m128[1];
  fVar239 = pre->ray_space[k].vx.field_0.m128[2];
  fVar201 = pre->ray_space[k].vx.field_0.m128[3];
  fVar240 = pre->ray_space[k].vy.field_0.m128[0];
  fVar207 = pre->ray_space[k].vy.field_0.m128[1];
  fVar241 = pre->ray_space[k].vy.field_0.m128[2];
  fVar202 = pre->ray_space[k].vy.field_0.m128[3];
  fVar242 = pre->ray_space[k].vz.field_0.m128[0];
  fVar203 = pre->ray_space[k].vz.field_0.m128[1];
  fVar243 = pre->ray_space[k].vz.field_0.m128[2];
  fVar204 = pre->ray_space[k].vz.field_0.m128[3];
  fVar244 = fVar224 * auVar210._0_4_ + auVar4._0_4_ * fVar242 + fVar240 * auVar229._0_4_;
  fVar208 = fVar188 * auVar210._4_4_ + auVar4._4_4_ * fVar203 + fVar207 * auVar229._4_4_;
  local_5a8._4_4_ = fVar208;
  local_5a8._0_4_ = fVar244;
  fStack_5a0 = fVar239 * auVar210._8_4_ + auVar4._8_4_ * fVar243 + fVar241 * auVar229._8_4_;
  fStack_59c = fVar201 * auVar210._12_4_ + auVar4._12_4_ * fVar204 + fVar202 * auVar229._12_4_;
  auVar9 = vsubps_avx(auVar280,auVar27);
  auVar4 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar229 = vmovshdup_avx(auVar9);
  auVar210 = vmovsldup_avx(auVar9);
  fVar205 = auVar210._0_4_ * fVar224 + auVar229._0_4_ * fVar240 + fVar242 * auVar4._0_4_;
  fVar217 = auVar210._4_4_ * fVar188 + auVar229._4_4_ * fVar207 + fVar203 * auVar4._4_4_;
  p00.field_0.v[1] = fVar217;
  p00.field_0.v[0] = fVar205;
  p00.field_0.v[2] = auVar210._8_4_ * fVar239 + auVar229._8_4_ * fVar241 + fVar243 * auVar4._8_4_;
  p00.field_0.v[3] = auVar210._12_4_ * fVar201 + auVar229._12_4_ * fVar202 + fVar204 * auVar4._12_4_
  ;
  auVar110._0_4_ = auVar290._0_4_ * 0.33333334;
  auVar110._4_4_ = auVar290._4_4_ * 0.33333334;
  auVar110._8_4_ = auVar290._8_4_ * 0.33333334;
  auVar110._12_4_ = auVar290._12_4_ * 0.33333334;
  auVar10 = vsubps_avx(auVar7,auVar110);
  auVar75 = vsubps_avx(auVar10,auVar27);
  auVar4 = vshufps_avx(auVar75,auVar75,0xaa);
  auVar229 = vmovshdup_avx(auVar75);
  auVar210 = vmovsldup_avx(auVar75);
  auVar327._0_4_ = auVar210._0_4_ * fVar224 + auVar229._0_4_ * fVar240 + fVar242 * auVar4._0_4_;
  auVar327._4_4_ = auVar210._4_4_ * fVar188 + auVar229._4_4_ * fVar207 + fVar203 * auVar4._4_4_;
  auVar327._8_4_ = auVar210._8_4_ * fVar239 + auVar229._8_4_ * fVar241 + fVar243 * auVar4._8_4_;
  auVar327._12_4_ = auVar210._12_4_ * fVar201 + auVar229._12_4_ * fVar202 + fVar204 * auVar4._12_4_;
  auVar104 = vsubps_avx(auVar7,auVar27);
  auVar4 = vshufps_avx(auVar104,auVar104,0xaa);
  auVar229 = vmovshdup_avx(auVar104);
  auVar210 = vmovsldup_avx(auVar104);
  auVar314._0_4_ = auVar210._0_4_ * fVar224 + auVar229._0_4_ * fVar240 + auVar4._0_4_ * fVar242;
  auVar314._4_4_ = auVar210._4_4_ * fVar188 + auVar229._4_4_ * fVar207 + auVar4._4_4_ * fVar203;
  auVar314._8_4_ = auVar210._8_4_ * fVar239 + auVar229._8_4_ * fVar241 + auVar4._8_4_ * fVar243;
  auVar314._12_4_ = auVar210._12_4_ * fVar201 + auVar229._12_4_ * fVar202 + auVar4._12_4_ * fVar204;
  auVar105 = vsubps_avx(auVar300,auVar27);
  auVar4 = vshufps_avx(auVar105,auVar105,0xaa);
  auVar229 = vmovshdup_avx(auVar105);
  auVar210 = vmovsldup_avx(auVar105);
  auVar301._0_4_ = auVar210._0_4_ * fVar224 + auVar229._0_4_ * fVar240 + auVar4._0_4_ * fVar242;
  auVar301._4_4_ = auVar210._4_4_ * fVar188 + auVar229._4_4_ * fVar207 + auVar4._4_4_ * fVar203;
  auVar301._8_4_ = auVar210._8_4_ * fVar239 + auVar229._8_4_ * fVar241 + auVar4._8_4_ * fVar243;
  auVar301._12_4_ = auVar210._12_4_ * fVar201 + auVar229._12_4_ * fVar202 + auVar4._12_4_ * fVar204;
  auVar76._0_4_ = (fVar223 + auVar221._0_4_) * 0.33333334 + auVar300._0_4_;
  auVar76._4_4_ = (fVar169 + auVar221._4_4_) * 0.33333334 + auVar300._4_4_;
  auVar76._8_4_ = (fVar206 + auVar221._8_4_) * 0.33333334 + auVar300._8_4_;
  auVar76._12_4_ = (fVar245 + auVar221._12_4_) * 0.33333334 + auVar300._12_4_;
  auVar133 = vsubps_avx(auVar76,auVar27);
  auVar4 = vshufps_avx(auVar133,auVar133,0xaa);
  auVar229 = vmovshdup_avx(auVar133);
  auVar210 = vmovsldup_avx(auVar133);
  auVar265._0_4_ = auVar210._0_4_ * fVar224 + auVar229._0_4_ * fVar240 + auVar4._0_4_ * fVar242;
  auVar265._4_4_ = auVar210._4_4_ * fVar188 + auVar229._4_4_ * fVar207 + auVar4._4_4_ * fVar203;
  auVar265._8_4_ = auVar210._8_4_ * fVar239 + auVar229._8_4_ * fVar241 + auVar4._8_4_ * fVar243;
  auVar265._12_4_ = auVar210._12_4_ * fVar201 + auVar229._12_4_ * fVar202 + auVar4._12_4_ * fVar204;
  auVar230._0_4_ = (fVar218 + auVar106._0_4_) * 0.33333334;
  auVar230._4_4_ = (fVar219 + auVar106._4_4_) * 0.33333334;
  auVar230._8_4_ = (fVar220 + auVar106._8_4_) * 0.33333334;
  auVar230._12_4_ = (fVar222 + auVar106._12_4_) * 0.33333334;
  auVar159 = vsubps_avx(auVar319,auVar230);
  auVar170 = vsubps_avx(auVar159,auVar27);
  auVar4 = vshufps_avx(auVar170,auVar170,0xaa);
  auVar229 = vmovshdup_avx(auVar170);
  auVar210 = vmovsldup_avx(auVar170);
  auVar107._0_4_ = auVar210._0_4_ * fVar224 + auVar229._0_4_ * fVar240 + fVar242 * auVar4._0_4_;
  auVar107._4_4_ = auVar210._4_4_ * fVar188 + auVar229._4_4_ * fVar207 + fVar203 * auVar4._4_4_;
  auVar107._8_4_ = auVar210._8_4_ * fVar239 + auVar229._8_4_ * fVar241 + fVar243 * auVar4._8_4_;
  auVar107._12_4_ = auVar210._12_4_ * fVar201 + auVar229._12_4_ * fVar202 + fVar204 * auVar4._12_4_;
  auVar189 = vsubps_avx(auVar319,auVar27);
  auVar27 = vshufps_avx(auVar189,auVar189,0xaa);
  auVar229 = vmovshdup_avx(auVar189);
  auVar210 = vmovsldup_avx(auVar189);
  auVar77._0_4_ = fVar224 * auVar210._0_4_ + fVar240 * auVar229._0_4_ + fVar242 * auVar27._0_4_;
  auVar77._4_4_ = fVar188 * auVar210._4_4_ + fVar207 * auVar229._4_4_ + fVar203 * auVar27._4_4_;
  auVar77._8_4_ = fVar239 * auVar210._8_4_ + fVar241 * auVar229._8_4_ + fVar243 * auVar27._8_4_;
  auVar77._12_4_ = fVar201 * auVar210._12_4_ + fVar202 * auVar229._12_4_ + fVar204 * auVar27._12_4_;
  auVar4 = vmovlhps_avx(_local_5a8,auVar301);
  auVar290 = vmovlhps_avx((undefined1  [16])p00.field_0,auVar265);
  auVar5 = vmovlhps_avx(auVar327,auVar107);
  auVar6 = vmovlhps_avx(auVar314,auVar77);
  auVar229 = vminps_avx(auVar4,auVar290);
  auVar210 = vminps_avx(auVar5,auVar6);
  auVar27 = vminps_avx(auVar229,auVar210);
  auVar229 = vmaxps_avx(auVar4,auVar290);
  auVar210 = vmaxps_avx(auVar5,auVar6);
  auVar229 = vmaxps_avx(auVar229,auVar210);
  auVar210 = vshufpd_avx(auVar27,auVar27,3);
  auVar27 = vminps_avx(auVar27,auVar210);
  auVar210 = vshufpd_avx(auVar229,auVar229,3);
  auVar210 = vmaxps_avx(auVar229,auVar210);
  auVar211._8_4_ = 0x7fffffff;
  auVar211._0_8_ = 0x7fffffff7fffffff;
  auVar211._12_4_ = 0x7fffffff;
  auVar229 = vandps_avx(auVar27,auVar211);
  auVar210 = vandps_avx(auVar210,auVar211);
  auVar229 = vmaxps_avx(auVar229,auVar210);
  auVar210 = vmovshdup_avx(auVar229);
  auVar229 = vmaxss_avx(auVar210,auVar229);
  fVar188 = auVar229._0_4_ * 9.536743e-07;
  auVar229 = vshufps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),0);
  local_78._16_16_ = auVar229;
  local_78._0_16_ = auVar229;
  auVar78._0_8_ = auVar229._0_8_ ^ 0x8000000080000000;
  auVar78._8_4_ = auVar229._8_4_ ^ 0x80000000;
  auVar78._12_4_ = auVar229._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar78;
  local_98._0_16_ = auVar78;
  auVar229 = vpshufd_avx(ZEXT416(uVar69),0);
  auVar210 = vpshufd_avx(ZEXT416(uVar12),0);
  uVar74 = 0;
  fVar224 = *(float *)(ray + k * 4 + 0x30);
  auVar27 = vsubps_avx(auVar290,auVar4);
  auVar209 = vsubps_avx(auVar5,auVar290);
  auVar78 = vsubps_avx(auVar6,auVar5);
  auVar106 = vsubps_avx(auVar300,auVar263);
  auVar134 = vsubps_avx(auVar76,auVar280);
  auVar135 = vsubps_avx(auVar159,auVar10);
  auVar171 = vsubps_avx(auVar319,auVar7);
  auVar326 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar331 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_009c6678:
  do {
    auVar227 = auVar331._0_16_;
    auVar226 = auVar326._0_16_;
    auVar82 = vshufps_avx(auVar226,auVar226,0x50);
    auVar320._8_4_ = 0x3f800000;
    auVar320._0_8_ = 0x3f8000003f800000;
    auVar320._12_4_ = 0x3f800000;
    auVar325._16_4_ = 0x3f800000;
    auVar325._0_16_ = auVar320;
    auVar325._20_4_ = 0x3f800000;
    auVar325._24_4_ = 0x3f800000;
    auVar325._28_4_ = 0x3f800000;
    auVar190 = vsubps_avx(auVar320,auVar82);
    fVar239 = auVar82._0_4_;
    fVar201 = auVar82._4_4_;
    fVar240 = auVar82._8_4_;
    fVar207 = auVar82._12_4_;
    fVar241 = auVar190._0_4_;
    fVar202 = auVar190._4_4_;
    fVar242 = auVar190._8_4_;
    fVar203 = auVar190._12_4_;
    auVar160._0_4_ = auVar301._0_4_ * fVar239 + fVar241 * fVar244;
    auVar160._4_4_ = auVar301._4_4_ * fVar201 + fVar202 * fVar208;
    auVar160._8_4_ = auVar301._0_4_ * fVar240 + fVar242 * fVar244;
    auVar160._12_4_ = auVar301._4_4_ * fVar207 + fVar203 * fVar208;
    auVar136._0_4_ = auVar265._0_4_ * fVar239 + fVar241 * fVar205;
    auVar136._4_4_ = auVar265._4_4_ * fVar201 + fVar202 * fVar217;
    auVar136._8_4_ = auVar265._0_4_ * fVar240 + fVar242 * fVar205;
    auVar136._12_4_ = auVar265._4_4_ * fVar207 + fVar203 * fVar217;
    auVar231._0_4_ = auVar107._0_4_ * fVar239 + auVar327._0_4_ * fVar241;
    auVar231._4_4_ = auVar107._4_4_ * fVar201 + auVar327._4_4_ * fVar202;
    auVar231._8_4_ = auVar107._0_4_ * fVar240 + auVar327._0_4_ * fVar242;
    auVar231._12_4_ = auVar107._4_4_ * fVar207 + auVar327._4_4_ * fVar203;
    auVar172._0_4_ = auVar77._0_4_ * fVar239 + auVar314._0_4_ * fVar241;
    auVar172._4_4_ = auVar77._4_4_ * fVar201 + auVar314._4_4_ * fVar202;
    auVar172._8_4_ = auVar77._0_4_ * fVar240 + auVar314._0_4_ * fVar242;
    auVar172._12_4_ = auVar77._4_4_ * fVar207 + auVar314._4_4_ * fVar203;
    auVar82 = vmovshdup_avx(auVar227);
    auVar190 = vshufps_avx(auVar227,auVar227,0);
    auVar271._16_16_ = auVar190;
    auVar271._0_16_ = auVar190;
    auVar153 = vshufps_avx(auVar227,auVar227,0x55);
    auVar98._16_16_ = auVar153;
    auVar98._0_16_ = auVar153;
    auVar94 = vsubps_avx(auVar98,auVar271);
    auVar153 = vshufps_avx(auVar160,auVar160,0);
    auVar122 = vshufps_avx(auVar160,auVar160,0x55);
    auVar110 = vshufps_avx(auVar136,auVar136,0);
    auVar139 = vshufps_avx(auVar136,auVar136,0x55);
    auVar111 = vshufps_avx(auVar231,auVar231,0);
    auVar221 = vshufps_avx(auVar231,auVar231,0x55);
    auVar211 = vshufps_avx(auVar172,auVar172,0);
    auVar225 = vshufps_avx(auVar172,auVar172,0x55);
    auVar82 = ZEXT416((uint)((auVar82._0_4_ - auVar331._0_4_) * 0.04761905));
    auVar82 = vshufps_avx(auVar82,auVar82,0);
    auVar286._0_4_ = auVar190._0_4_ + auVar94._0_4_ * 0.0;
    auVar286._4_4_ = auVar190._4_4_ + auVar94._4_4_ * 0.14285715;
    auVar286._8_4_ = auVar190._8_4_ + auVar94._8_4_ * 0.2857143;
    auVar286._12_4_ = auVar190._12_4_ + auVar94._12_4_ * 0.42857146;
    auVar286._16_4_ = auVar190._0_4_ + auVar94._16_4_ * 0.5714286;
    auVar286._20_4_ = auVar190._4_4_ + auVar94._20_4_ * 0.71428573;
    auVar286._24_4_ = auVar190._8_4_ + auVar94._24_4_ * 0.8571429;
    auVar286._28_4_ = auVar190._12_4_ + auVar94._28_4_;
    auVar21 = vsubps_avx(auVar325,auVar286);
    fVar239 = auVar110._0_4_;
    fVar240 = auVar110._4_4_;
    fVar241 = auVar110._8_4_;
    fVar242 = auVar110._12_4_;
    fVar258 = auVar21._0_4_;
    fVar273 = auVar21._4_4_;
    fVar274 = auVar21._8_4_;
    fVar275 = auVar21._12_4_;
    fVar276 = auVar21._16_4_;
    fVar277 = auVar21._20_4_;
    fVar278 = auVar21._24_4_;
    fVar254 = auVar139._0_4_;
    fVar255 = auVar139._4_4_;
    fVar256 = auVar139._8_4_;
    fVar257 = auVar139._12_4_;
    fVar317 = auVar122._12_4_ + 1.0;
    fVar206 = auVar111._0_4_;
    fVar245 = auVar111._4_4_;
    fVar246 = auVar111._8_4_;
    fVar253 = auVar111._12_4_;
    fVar243 = fVar206 * auVar286._0_4_ + fVar258 * fVar239;
    fVar204 = fVar245 * auVar286._4_4_ + fVar273 * fVar240;
    fVar218 = fVar246 * auVar286._8_4_ + fVar274 * fVar241;
    fVar219 = fVar253 * auVar286._12_4_ + fVar275 * fVar242;
    fVar220 = fVar206 * auVar286._16_4_ + fVar276 * fVar239;
    fVar222 = fVar245 * auVar286._20_4_ + fVar277 * fVar240;
    fVar223 = fVar246 * auVar286._24_4_ + fVar278 * fVar241;
    fVar201 = auVar221._0_4_;
    fVar207 = auVar221._4_4_;
    fVar202 = auVar221._8_4_;
    fVar203 = auVar221._12_4_;
    fVar298 = fVar254 * fVar258 + auVar286._0_4_ * fVar201;
    fVar305 = fVar255 * fVar273 + auVar286._4_4_ * fVar207;
    fVar306 = fVar256 * fVar274 + auVar286._8_4_ * fVar202;
    fVar307 = fVar257 * fVar275 + auVar286._12_4_ * fVar203;
    fVar308 = fVar254 * fVar276 + auVar286._16_4_ * fVar201;
    fVar309 = fVar255 * fVar277 + auVar286._20_4_ * fVar207;
    fVar310 = fVar256 * fVar278 + auVar286._24_4_ * fVar202;
    fVar311 = fVar257 + fVar242;
    auVar190 = vshufps_avx(auVar160,auVar160,0xaa);
    auVar110 = vshufps_avx(auVar160,auVar160,0xff);
    fVar169 = fVar253 + 0.0;
    auVar139 = vshufps_avx(auVar136,auVar136,0xaa);
    auVar111 = vshufps_avx(auVar136,auVar136,0xff);
    auVar186._0_4_ =
         fVar258 * (auVar286._0_4_ * fVar239 + fVar258 * auVar153._0_4_) + auVar286._0_4_ * fVar243;
    auVar186._4_4_ =
         fVar273 * (auVar286._4_4_ * fVar240 + fVar273 * auVar153._4_4_) + auVar286._4_4_ * fVar204;
    auVar186._8_4_ =
         fVar274 * (auVar286._8_4_ * fVar241 + fVar274 * auVar153._8_4_) + auVar286._8_4_ * fVar218;
    auVar186._12_4_ =
         fVar275 * (auVar286._12_4_ * fVar242 + fVar275 * auVar153._12_4_) +
         auVar286._12_4_ * fVar219;
    auVar186._16_4_ =
         fVar276 * (auVar286._16_4_ * fVar239 + fVar276 * auVar153._0_4_) +
         auVar286._16_4_ * fVar220;
    auVar186._20_4_ =
         fVar277 * (auVar286._20_4_ * fVar240 + fVar277 * auVar153._4_4_) +
         auVar286._20_4_ * fVar222;
    auVar186._24_4_ =
         fVar278 * (auVar286._24_4_ * fVar241 + fVar278 * auVar153._8_4_) +
         auVar286._24_4_ * fVar223;
    auVar186._28_4_ = auVar153._12_4_ + 1.0 + fVar203;
    auVar199._0_4_ =
         fVar258 * (fVar254 * auVar286._0_4_ + auVar122._0_4_ * fVar258) + auVar286._0_4_ * fVar298;
    auVar199._4_4_ =
         fVar273 * (fVar255 * auVar286._4_4_ + auVar122._4_4_ * fVar273) + auVar286._4_4_ * fVar305;
    auVar199._8_4_ =
         fVar274 * (fVar256 * auVar286._8_4_ + auVar122._8_4_ * fVar274) + auVar286._8_4_ * fVar306;
    auVar199._12_4_ =
         fVar275 * (fVar257 * auVar286._12_4_ + auVar122._12_4_ * fVar275) +
         auVar286._12_4_ * fVar307;
    auVar199._16_4_ =
         fVar276 * (fVar254 * auVar286._16_4_ + auVar122._0_4_ * fVar276) +
         auVar286._16_4_ * fVar308;
    auVar199._20_4_ =
         fVar277 * (fVar255 * auVar286._20_4_ + auVar122._4_4_ * fVar277) +
         auVar286._20_4_ * fVar309;
    auVar199._24_4_ =
         fVar278 * (fVar256 * auVar286._24_4_ + auVar122._8_4_ * fVar278) +
         auVar286._24_4_ * fVar310;
    auVar199._28_4_ = auVar225._12_4_ + fVar203;
    auVar99._0_4_ =
         fVar258 * fVar243 + auVar286._0_4_ * (fVar206 * fVar258 + auVar211._0_4_ * auVar286._0_4_);
    auVar99._4_4_ =
         fVar273 * fVar204 + auVar286._4_4_ * (fVar245 * fVar273 + auVar211._4_4_ * auVar286._4_4_);
    auVar99._8_4_ =
         fVar274 * fVar218 + auVar286._8_4_ * (fVar246 * fVar274 + auVar211._8_4_ * auVar286._8_4_);
    auVar99._12_4_ =
         fVar275 * fVar219 +
         auVar286._12_4_ * (fVar253 * fVar275 + auVar211._12_4_ * auVar286._12_4_);
    auVar99._16_4_ =
         fVar276 * fVar220 +
         auVar286._16_4_ * (fVar206 * fVar276 + auVar211._0_4_ * auVar286._16_4_);
    auVar99._20_4_ =
         fVar277 * fVar222 +
         auVar286._20_4_ * (fVar245 * fVar277 + auVar211._4_4_ * auVar286._20_4_);
    auVar99._24_4_ =
         fVar278 * fVar223 +
         auVar286._24_4_ * (fVar246 * fVar278 + auVar211._8_4_ * auVar286._24_4_);
    auVar99._28_4_ = fVar242 + 1.0 + fVar169;
    auVar297._0_4_ =
         fVar258 * fVar298 + auVar286._0_4_ * (auVar225._0_4_ * auVar286._0_4_ + fVar258 * fVar201);
    auVar297._4_4_ =
         fVar273 * fVar305 + auVar286._4_4_ * (auVar225._4_4_ * auVar286._4_4_ + fVar273 * fVar207);
    auVar297._8_4_ =
         fVar274 * fVar306 + auVar286._8_4_ * (auVar225._8_4_ * auVar286._8_4_ + fVar274 * fVar202);
    auVar297._12_4_ =
         fVar275 * fVar307 +
         auVar286._12_4_ * (auVar225._12_4_ * auVar286._12_4_ + fVar275 * fVar203);
    auVar297._16_4_ =
         fVar276 * fVar308 +
         auVar286._16_4_ * (auVar225._0_4_ * auVar286._16_4_ + fVar276 * fVar201);
    auVar297._20_4_ =
         fVar277 * fVar309 +
         auVar286._20_4_ * (auVar225._4_4_ * auVar286._20_4_ + fVar277 * fVar207);
    auVar297._24_4_ =
         fVar278 * fVar310 +
         auVar286._24_4_ * (auVar225._8_4_ * auVar286._24_4_ + fVar278 * fVar202);
    auVar297._28_4_ = fVar169 + fVar203 + 0.0;
    local_d8._0_4_ = fVar258 * auVar186._0_4_ + auVar286._0_4_ * auVar99._0_4_;
    local_d8._4_4_ = fVar273 * auVar186._4_4_ + auVar286._4_4_ * auVar99._4_4_;
    local_d8._8_4_ = fVar274 * auVar186._8_4_ + auVar286._8_4_ * auVar99._8_4_;
    local_d8._12_4_ = fVar275 * auVar186._12_4_ + auVar286._12_4_ * auVar99._12_4_;
    local_d8._16_4_ = fVar276 * auVar186._16_4_ + auVar286._16_4_ * auVar99._16_4_;
    local_d8._20_4_ = fVar277 * auVar186._20_4_ + auVar286._20_4_ * auVar99._20_4_;
    local_d8._24_4_ = fVar278 * auVar186._24_4_ + auVar286._24_4_ * auVar99._24_4_;
    local_d8._28_4_ = fVar311 + fVar203 + 0.0;
    auVar168._0_4_ = fVar258 * auVar199._0_4_ + auVar286._0_4_ * auVar297._0_4_;
    auVar168._4_4_ = fVar273 * auVar199._4_4_ + auVar286._4_4_ * auVar297._4_4_;
    auVar168._8_4_ = fVar274 * auVar199._8_4_ + auVar286._8_4_ * auVar297._8_4_;
    auVar168._12_4_ = fVar275 * auVar199._12_4_ + auVar286._12_4_ * auVar297._12_4_;
    auVar168._16_4_ = fVar276 * auVar199._16_4_ + auVar286._16_4_ * auVar297._16_4_;
    auVar168._20_4_ = fVar277 * auVar199._20_4_ + auVar286._20_4_ * auVar297._20_4_;
    auVar168._24_4_ = fVar278 * auVar199._24_4_ + auVar286._24_4_ * auVar297._24_4_;
    auVar168._28_4_ = fVar311 + fVar169;
    auVar22 = vsubps_avx(auVar99,auVar186);
    auVar94 = vsubps_avx(auVar297,auVar199);
    local_4e8 = auVar82._0_4_;
    fStack_4e4 = auVar82._4_4_;
    fStack_4e0 = auVar82._8_4_;
    fStack_4dc = auVar82._12_4_;
    local_118 = local_4e8 * auVar22._0_4_ * 3.0;
    fStack_114 = fStack_4e4 * auVar22._4_4_ * 3.0;
    auVar30._4_4_ = fStack_114;
    auVar30._0_4_ = local_118;
    fStack_110 = fStack_4e0 * auVar22._8_4_ * 3.0;
    auVar30._8_4_ = fStack_110;
    fStack_10c = fStack_4dc * auVar22._12_4_ * 3.0;
    auVar30._12_4_ = fStack_10c;
    fStack_108 = local_4e8 * auVar22._16_4_ * 3.0;
    auVar30._16_4_ = fStack_108;
    fStack_104 = fStack_4e4 * auVar22._20_4_ * 3.0;
    auVar30._20_4_ = fStack_104;
    fStack_100 = fStack_4e0 * auVar22._24_4_ * 3.0;
    auVar30._24_4_ = fStack_100;
    auVar30._28_4_ = auVar22._28_4_;
    local_138 = local_4e8 * auVar94._0_4_ * 3.0;
    fStack_134 = fStack_4e4 * auVar94._4_4_ * 3.0;
    auVar31._4_4_ = fStack_134;
    auVar31._0_4_ = local_138;
    fStack_130 = fStack_4e0 * auVar94._8_4_ * 3.0;
    auVar31._8_4_ = fStack_130;
    fStack_12c = fStack_4dc * auVar94._12_4_ * 3.0;
    auVar31._12_4_ = fStack_12c;
    fStack_128 = local_4e8 * auVar94._16_4_ * 3.0;
    auVar31._16_4_ = fStack_128;
    fStack_124 = fStack_4e4 * auVar94._20_4_ * 3.0;
    auVar31._20_4_ = fStack_124;
    fStack_120 = fStack_4e0 * auVar94._24_4_ * 3.0;
    auVar31._24_4_ = fStack_120;
    auVar31._28_4_ = fVar311;
    auVar19 = vsubps_avx(local_d8,auVar30);
    auVar94 = vperm2f128_avx(auVar19,auVar19,1);
    auVar94 = vshufps_avx(auVar94,auVar19,0x30);
    auVar94 = vshufps_avx(auVar19,auVar94,0x29);
    auVar20 = vsubps_avx(auVar168,auVar31);
    auVar19 = vperm2f128_avx(auVar20,auVar20,1);
    auVar19 = vshufps_avx(auVar19,auVar20,0x30);
    auVar20 = vshufps_avx(auVar20,auVar19,0x29);
    fVar309 = auVar139._0_4_;
    fVar310 = auVar139._4_4_;
    fVar332 = auVar139._8_4_;
    fVar242 = auVar190._12_4_;
    fVar245 = auVar111._0_4_;
    fVar253 = auVar111._4_4_;
    fVar298 = auVar111._8_4_;
    fVar305 = auVar111._12_4_;
    auVar82 = vshufps_avx(auVar231,auVar231,0xaa);
    fVar239 = auVar82._0_4_;
    fVar240 = auVar82._4_4_;
    fVar241 = auVar82._8_4_;
    fVar203 = auVar82._12_4_;
    fVar218 = auVar286._0_4_ * fVar239 + fVar309 * fVar258;
    fVar219 = auVar286._4_4_ * fVar240 + fVar310 * fVar273;
    fVar220 = auVar286._8_4_ * fVar241 + fVar332 * fVar274;
    fVar222 = auVar286._12_4_ * fVar203 + auVar139._12_4_ * fVar275;
    fVar223 = auVar286._16_4_ * fVar239 + fVar309 * fVar276;
    fVar169 = auVar286._20_4_ * fVar240 + fVar310 * fVar277;
    fVar206 = auVar286._24_4_ * fVar241 + fVar332 * fVar278;
    auVar82 = vshufps_avx(auVar231,auVar231,0xff);
    fVar201 = auVar82._0_4_;
    fVar207 = auVar82._4_4_;
    fVar202 = auVar82._8_4_;
    fVar243 = auVar82._12_4_;
    fVar246 = auVar286._0_4_ * fVar201 + fVar245 * fVar258;
    fVar254 = auVar286._4_4_ * fVar207 + fVar253 * fVar273;
    fVar255 = auVar286._8_4_ * fVar202 + fVar298 * fVar274;
    fVar256 = auVar286._12_4_ * fVar243 + fVar305 * fVar275;
    fVar306 = auVar286._16_4_ * fVar201 + fVar245 * fVar276;
    fVar257 = auVar286._20_4_ * fVar207 + fVar253 * fVar277;
    fVar307 = auVar286._24_4_ * fVar202 + fVar298 * fVar278;
    auVar82 = vshufps_avx(auVar172,auVar172,0xaa);
    fVar308 = auVar82._12_4_ + fVar203;
    auVar153 = vshufps_avx(auVar172,auVar172,0xff);
    fVar204 = auVar153._12_4_;
    auVar100._0_4_ =
         fVar258 * (fVar309 * auVar286._0_4_ + fVar258 * auVar190._0_4_) + auVar286._0_4_ * fVar218;
    auVar100._4_4_ =
         fVar273 * (fVar310 * auVar286._4_4_ + fVar273 * auVar190._4_4_) + auVar286._4_4_ * fVar219;
    auVar100._8_4_ =
         fVar274 * (fVar332 * auVar286._8_4_ + fVar274 * auVar190._8_4_) + auVar286._8_4_ * fVar220;
    auVar100._12_4_ =
         fVar275 * (auVar139._12_4_ * auVar286._12_4_ + fVar275 * fVar242) +
         auVar286._12_4_ * fVar222;
    auVar100._16_4_ =
         fVar276 * (fVar309 * auVar286._16_4_ + fVar276 * auVar190._0_4_) +
         auVar286._16_4_ * fVar223;
    auVar100._20_4_ =
         fVar277 * (fVar310 * auVar286._20_4_ + fVar277 * auVar190._4_4_) +
         auVar286._20_4_ * fVar169;
    auVar100._24_4_ =
         fVar278 * (fVar332 * auVar286._24_4_ + fVar278 * auVar190._8_4_) +
         auVar286._24_4_ * fVar206;
    auVar100._28_4_ = auVar20._28_4_ + fVar242 + fVar204;
    auVar129._0_4_ =
         fVar258 * (fVar245 * auVar286._0_4_ + auVar110._0_4_ * fVar258) + auVar286._0_4_ * fVar246;
    auVar129._4_4_ =
         fVar273 * (fVar253 * auVar286._4_4_ + auVar110._4_4_ * fVar273) + auVar286._4_4_ * fVar254;
    auVar129._8_4_ =
         fVar274 * (fVar298 * auVar286._8_4_ + auVar110._8_4_ * fVar274) + auVar286._8_4_ * fVar255;
    auVar129._12_4_ =
         fVar275 * (fVar305 * auVar286._12_4_ + auVar110._12_4_ * fVar275) +
         auVar286._12_4_ * fVar256;
    auVar129._16_4_ =
         fVar276 * (fVar245 * auVar286._16_4_ + auVar110._0_4_ * fVar276) +
         auVar286._16_4_ * fVar306;
    auVar129._20_4_ =
         fVar277 * (fVar253 * auVar286._20_4_ + auVar110._4_4_ * fVar277) +
         auVar286._20_4_ * fVar257;
    auVar129._24_4_ =
         fVar278 * (fVar298 * auVar286._24_4_ + auVar110._8_4_ * fVar278) +
         auVar286._24_4_ * fVar307;
    auVar129._28_4_ = fVar242 + auVar19._28_4_ + fVar204;
    auVar19 = vperm2f128_avx(local_d8,local_d8,1);
    auVar19 = vshufps_avx(auVar19,local_d8,0x30);
    auVar23 = vshufps_avx(local_d8,auVar19,0x29);
    auVar200._0_4_ =
         auVar286._0_4_ * (auVar82._0_4_ * auVar286._0_4_ + fVar258 * fVar239) + fVar258 * fVar218;
    auVar200._4_4_ =
         auVar286._4_4_ * (auVar82._4_4_ * auVar286._4_4_ + fVar273 * fVar240) + fVar273 * fVar219;
    auVar200._8_4_ =
         auVar286._8_4_ * (auVar82._8_4_ * auVar286._8_4_ + fVar274 * fVar241) + fVar274 * fVar220;
    auVar200._12_4_ =
         auVar286._12_4_ * (auVar82._12_4_ * auVar286._12_4_ + fVar275 * fVar203) +
         fVar275 * fVar222;
    auVar200._16_4_ =
         auVar286._16_4_ * (auVar82._0_4_ * auVar286._16_4_ + fVar276 * fVar239) + fVar276 * fVar223
    ;
    auVar200._20_4_ =
         auVar286._20_4_ * (auVar82._4_4_ * auVar286._20_4_ + fVar277 * fVar240) + fVar277 * fVar169
    ;
    auVar200._24_4_ =
         auVar286._24_4_ * (auVar82._8_4_ * auVar286._24_4_ + fVar278 * fVar241) + fVar278 * fVar206
    ;
    auVar200._28_4_ = fVar308 + fVar317 + auVar199._28_4_;
    auVar252._0_4_ =
         fVar258 * fVar246 + auVar286._0_4_ * (auVar286._0_4_ * auVar153._0_4_ + fVar258 * fVar201);
    auVar252._4_4_ =
         fVar273 * fVar254 + auVar286._4_4_ * (auVar286._4_4_ * auVar153._4_4_ + fVar273 * fVar207);
    auVar252._8_4_ =
         fVar274 * fVar255 + auVar286._8_4_ * (auVar286._8_4_ * auVar153._8_4_ + fVar274 * fVar202);
    auVar252._12_4_ =
         fVar275 * fVar256 + auVar286._12_4_ * (auVar286._12_4_ * fVar204 + fVar275 * fVar243);
    auVar252._16_4_ =
         fVar276 * fVar306 +
         auVar286._16_4_ * (auVar286._16_4_ * auVar153._0_4_ + fVar276 * fVar201);
    auVar252._20_4_ =
         fVar277 * fVar257 +
         auVar286._20_4_ * (auVar286._20_4_ * auVar153._4_4_ + fVar277 * fVar207);
    auVar252._24_4_ =
         fVar278 * fVar307 +
         auVar286._24_4_ * (auVar286._24_4_ * auVar153._8_4_ + fVar278 * fVar202);
    auVar252._28_4_ = fVar317 + fVar305 + fVar204 + fVar243;
    auVar238._0_4_ = fVar258 * auVar100._0_4_ + auVar286._0_4_ * auVar200._0_4_;
    auVar238._4_4_ = fVar273 * auVar100._4_4_ + auVar286._4_4_ * auVar200._4_4_;
    auVar238._8_4_ = fVar274 * auVar100._8_4_ + auVar286._8_4_ * auVar200._8_4_;
    auVar238._12_4_ = fVar275 * auVar100._12_4_ + auVar286._12_4_ * auVar200._12_4_;
    auVar238._16_4_ = fVar276 * auVar100._16_4_ + auVar286._16_4_ * auVar200._16_4_;
    auVar238._20_4_ = fVar277 * auVar100._20_4_ + auVar286._20_4_ * auVar200._20_4_;
    auVar238._24_4_ = fVar278 * auVar100._24_4_ + auVar286._24_4_ * auVar200._24_4_;
    auVar238._28_4_ = fVar308 + fVar204 + fVar243;
    auVar272._0_4_ = fVar258 * auVar129._0_4_ + auVar286._0_4_ * auVar252._0_4_;
    auVar272._4_4_ = fVar273 * auVar129._4_4_ + auVar286._4_4_ * auVar252._4_4_;
    auVar272._8_4_ = fVar274 * auVar129._8_4_ + auVar286._8_4_ * auVar252._8_4_;
    auVar272._12_4_ = fVar275 * auVar129._12_4_ + auVar286._12_4_ * auVar252._12_4_;
    auVar272._16_4_ = fVar276 * auVar129._16_4_ + auVar286._16_4_ * auVar252._16_4_;
    auVar272._20_4_ = fVar277 * auVar129._20_4_ + auVar286._20_4_ * auVar252._20_4_;
    auVar272._24_4_ = fVar278 * auVar129._24_4_ + auVar286._24_4_ * auVar252._24_4_;
    auVar272._28_4_ = auVar21._28_4_ + auVar286._28_4_;
    auVar26 = vsubps_avx(auVar200,auVar100);
    auVar19 = vsubps_avx(auVar252,auVar129);
    local_158 = local_4e8 * auVar26._0_4_ * 3.0;
    fStack_154 = fStack_4e4 * auVar26._4_4_ * 3.0;
    auVar32._4_4_ = fStack_154;
    auVar32._0_4_ = local_158;
    fStack_150 = fStack_4e0 * auVar26._8_4_ * 3.0;
    auVar32._8_4_ = fStack_150;
    fStack_14c = fStack_4dc * auVar26._12_4_ * 3.0;
    auVar32._12_4_ = fStack_14c;
    fStack_148 = local_4e8 * auVar26._16_4_ * 3.0;
    auVar32._16_4_ = fStack_148;
    fStack_144 = fStack_4e4 * auVar26._20_4_ * 3.0;
    auVar32._20_4_ = fStack_144;
    fStack_140 = fStack_4e0 * auVar26._24_4_ * 3.0;
    auVar32._24_4_ = fStack_140;
    auVar32._28_4_ = auVar26._28_4_;
    local_178 = local_4e8 * auVar19._0_4_ * 3.0;
    fStack_174 = fStack_4e4 * auVar19._4_4_ * 3.0;
    auVar33._4_4_ = fStack_174;
    auVar33._0_4_ = local_178;
    fStack_170 = fStack_4e0 * auVar19._8_4_ * 3.0;
    auVar33._8_4_ = fStack_170;
    fStack_16c = fStack_4dc * auVar19._12_4_ * 3.0;
    auVar33._12_4_ = fStack_16c;
    fStack_168 = local_4e8 * auVar19._16_4_ * 3.0;
    auVar33._16_4_ = fStack_168;
    fStack_164 = fStack_4e4 * auVar19._20_4_ * 3.0;
    auVar33._20_4_ = fStack_164;
    fStack_160 = fStack_4e0 * auVar19._24_4_ * 3.0;
    auVar33._24_4_ = fStack_160;
    auVar33._28_4_ = auVar200._28_4_;
    auVar19 = vperm2f128_avx(auVar238,auVar238,1);
    auVar19 = vshufps_avx(auVar19,auVar238,0x30);
    auVar24 = vshufps_avx(auVar238,auVar19,0x29);
    auVar21 = vsubps_avx(auVar238,auVar32);
    auVar19 = vperm2f128_avx(auVar21,auVar21,1);
    auVar19 = vshufps_avx(auVar19,auVar21,0x30);
    auVar19 = vshufps_avx(auVar21,auVar19,0x29);
    auVar25 = vsubps_avx(auVar272,auVar33);
    auVar21 = vperm2f128_avx(auVar25,auVar25,1);
    auVar21 = vshufps_avx(auVar21,auVar25,0x30);
    local_b8 = vshufps_avx(auVar25,auVar21,0x29);
    auVar28 = vsubps_avx(auVar238,local_d8);
    auVar29 = vsubps_avx(auVar24,auVar23);
    fVar239 = auVar29._0_4_ + auVar28._0_4_;
    fVar201 = auVar29._4_4_ + auVar28._4_4_;
    fVar240 = auVar29._8_4_ + auVar28._8_4_;
    fVar207 = auVar29._12_4_ + auVar28._12_4_;
    fVar241 = auVar29._16_4_ + auVar28._16_4_;
    fVar202 = auVar29._20_4_ + auVar28._20_4_;
    fVar242 = auVar29._24_4_ + auVar28._24_4_;
    auVar21 = vperm2f128_avx(auVar168,auVar168,1);
    auVar21 = vshufps_avx(auVar21,auVar168,0x30);
    local_f8 = vshufps_avx(auVar168,auVar21,0x29);
    auVar21 = vperm2f128_avx(auVar272,auVar272,1);
    auVar21 = vshufps_avx(auVar21,auVar272,0x30);
    auVar25 = vshufps_avx(auVar272,auVar21,0x29);
    auVar21 = vsubps_avx(auVar272,auVar168);
    auVar95 = vsubps_avx(auVar25,local_f8);
    fVar203 = auVar95._0_4_ + auVar21._0_4_;
    fVar243 = auVar95._4_4_ + auVar21._4_4_;
    fVar204 = auVar95._8_4_ + auVar21._8_4_;
    fVar218 = auVar95._12_4_ + auVar21._12_4_;
    fVar219 = auVar95._16_4_ + auVar21._16_4_;
    fVar220 = auVar95._20_4_ + auVar21._20_4_;
    fVar222 = auVar95._24_4_ + auVar21._24_4_;
    auVar34._4_4_ = fVar201 * auVar168._4_4_;
    auVar34._0_4_ = fVar239 * auVar168._0_4_;
    auVar34._8_4_ = fVar240 * auVar168._8_4_;
    auVar34._12_4_ = fVar207 * auVar168._12_4_;
    auVar34._16_4_ = fVar241 * auVar168._16_4_;
    auVar34._20_4_ = fVar202 * auVar168._20_4_;
    auVar34._24_4_ = fVar242 * auVar168._24_4_;
    auVar34._28_4_ = auVar21._28_4_;
    auVar35._4_4_ = fVar243 * local_d8._4_4_;
    auVar35._0_4_ = fVar203 * local_d8._0_4_;
    auVar35._8_4_ = fVar204 * local_d8._8_4_;
    auVar35._12_4_ = fVar218 * local_d8._12_4_;
    auVar35._16_4_ = fVar219 * local_d8._16_4_;
    auVar35._20_4_ = fVar220 * local_d8._20_4_;
    auVar35._24_4_ = fVar222 * local_d8._24_4_;
    auVar35._28_4_ = fVar308;
    auVar96 = vsubps_avx(auVar34,auVar35);
    local_118 = local_d8._0_4_ + local_118;
    fStack_114 = local_d8._4_4_ + fStack_114;
    fStack_110 = local_d8._8_4_ + fStack_110;
    fStack_10c = local_d8._12_4_ + fStack_10c;
    fStack_108 = local_d8._16_4_ + fStack_108;
    fStack_104 = local_d8._20_4_ + fStack_104;
    fStack_100 = local_d8._24_4_ + fStack_100;
    fStack_fc = local_d8._28_4_ + auVar22._28_4_;
    local_138 = local_138 + auVar168._0_4_;
    fStack_134 = fStack_134 + auVar168._4_4_;
    fStack_130 = fStack_130 + auVar168._8_4_;
    fStack_12c = fStack_12c + auVar168._12_4_;
    fStack_128 = fStack_128 + auVar168._16_4_;
    fStack_124 = fStack_124 + auVar168._20_4_;
    fStack_120 = fStack_120 + auVar168._24_4_;
    fStack_11c = fVar311 + auVar168._28_4_;
    auVar36._4_4_ = fVar201 * fStack_134;
    auVar36._0_4_ = fVar239 * local_138;
    auVar36._8_4_ = fVar240 * fStack_130;
    auVar36._12_4_ = fVar207 * fStack_12c;
    auVar36._16_4_ = fVar241 * fStack_128;
    auVar36._20_4_ = fVar202 * fStack_124;
    auVar36._24_4_ = fVar242 * fStack_120;
    auVar36._28_4_ = fVar311;
    auVar37._4_4_ = fVar243 * fStack_114;
    auVar37._0_4_ = fVar203 * local_118;
    auVar37._8_4_ = fVar204 * fStack_110;
    auVar37._12_4_ = fVar218 * fStack_10c;
    auVar37._16_4_ = fVar219 * fStack_108;
    auVar37._20_4_ = fVar220 * fStack_104;
    auVar37._24_4_ = fVar222 * fStack_100;
    auVar37._28_4_ = fVar311 + auVar168._28_4_;
    auVar22 = vsubps_avx(auVar36,auVar37);
    local_5c8._0_4_ = auVar20._0_4_;
    local_5c8._4_4_ = auVar20._4_4_;
    fStack_5c0 = auVar20._8_4_;
    fStack_5bc = auVar20._12_4_;
    fStack_5b8 = auVar20._16_4_;
    fStack_5b4 = auVar20._20_4_;
    fStack_5b0 = auVar20._24_4_;
    auVar38._4_4_ = fVar201 * (float)local_5c8._4_4_;
    auVar38._0_4_ = fVar239 * (float)local_5c8._0_4_;
    auVar38._8_4_ = fVar240 * fStack_5c0;
    auVar38._12_4_ = fVar207 * fStack_5bc;
    auVar38._16_4_ = fVar241 * fStack_5b8;
    auVar38._20_4_ = fVar202 * fStack_5b4;
    auVar38._24_4_ = fVar242 * fStack_5b0;
    auVar38._28_4_ = fVar311;
    local_5a8._0_4_ = auVar94._0_4_;
    local_5a8._4_4_ = auVar94._4_4_;
    fStack_5a0 = auVar94._8_4_;
    fStack_59c = auVar94._12_4_;
    fStack_598 = auVar94._16_4_;
    fStack_594 = auVar94._20_4_;
    fStack_590 = auVar94._24_4_;
    auVar39._4_4_ = fVar243 * (float)local_5a8._4_4_;
    auVar39._0_4_ = fVar203 * (float)local_5a8._0_4_;
    auVar39._8_4_ = fVar204 * fStack_5a0;
    auVar39._12_4_ = fVar218 * fStack_59c;
    auVar39._16_4_ = fVar219 * fStack_598;
    auVar39._20_4_ = fVar220 * fStack_594;
    auVar39._24_4_ = fVar222 * fStack_590;
    auVar39._28_4_ = local_d8._28_4_;
    auVar97 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = local_f8._4_4_ * fVar201;
    auVar40._0_4_ = local_f8._0_4_ * fVar239;
    auVar40._8_4_ = local_f8._8_4_ * fVar240;
    auVar40._12_4_ = local_f8._12_4_ * fVar207;
    auVar40._16_4_ = local_f8._16_4_ * fVar241;
    auVar40._20_4_ = local_f8._20_4_ * fVar202;
    auVar40._24_4_ = local_f8._24_4_ * fVar242;
    auVar40._28_4_ = fVar311;
    auVar41._4_4_ = auVar23._4_4_ * fVar243;
    auVar41._0_4_ = auVar23._0_4_ * fVar203;
    auVar41._8_4_ = auVar23._8_4_ * fVar204;
    auVar41._12_4_ = auVar23._12_4_ * fVar218;
    auVar41._16_4_ = auVar23._16_4_ * fVar219;
    auVar41._20_4_ = auVar23._20_4_ * fVar220;
    auVar41._24_4_ = auVar23._24_4_ * fVar222;
    auVar41._28_4_ = local_f8._28_4_;
    local_4e8 = auVar19._0_4_;
    fStack_4e4 = auVar19._4_4_;
    fStack_4e0 = auVar19._8_4_;
    fStack_4dc = auVar19._12_4_;
    fStack_4d8 = auVar19._16_4_;
    fStack_4d4 = auVar19._20_4_;
    fStack_4d0 = auVar19._24_4_;
    auVar125 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = auVar272._4_4_ * fVar201;
    auVar42._0_4_ = auVar272._0_4_ * fVar239;
    auVar42._8_4_ = auVar272._8_4_ * fVar240;
    auVar42._12_4_ = auVar272._12_4_ * fVar207;
    auVar42._16_4_ = auVar272._16_4_ * fVar241;
    auVar42._20_4_ = auVar272._20_4_ * fVar202;
    auVar42._24_4_ = auVar272._24_4_ * fVar242;
    auVar42._28_4_ = fVar311;
    auVar43._4_4_ = fVar243 * auVar238._4_4_;
    auVar43._0_4_ = fVar203 * auVar238._0_4_;
    auVar43._8_4_ = fVar204 * auVar238._8_4_;
    auVar43._12_4_ = fVar218 * auVar238._12_4_;
    auVar43._16_4_ = fVar219 * auVar238._16_4_;
    auVar43._20_4_ = fVar220 * auVar238._20_4_;
    auVar43._24_4_ = fVar222 * auVar238._24_4_;
    auVar43._28_4_ = fStack_fc;
    auVar126 = vsubps_avx(auVar42,auVar43);
    local_158 = auVar238._0_4_ + local_158;
    fStack_154 = auVar238._4_4_ + fStack_154;
    fStack_150 = auVar238._8_4_ + fStack_150;
    fStack_14c = auVar238._12_4_ + fStack_14c;
    fStack_148 = auVar238._16_4_ + fStack_148;
    fStack_144 = auVar238._20_4_ + fStack_144;
    fStack_140 = auVar238._24_4_ + fStack_140;
    fStack_13c = auVar238._28_4_ + auVar26._28_4_;
    local_178 = auVar272._0_4_ + local_178;
    fStack_174 = auVar272._4_4_ + fStack_174;
    fStack_170 = auVar272._8_4_ + fStack_170;
    fStack_16c = auVar272._12_4_ + fStack_16c;
    fStack_168 = auVar272._16_4_ + fStack_168;
    fStack_164 = auVar272._20_4_ + fStack_164;
    fStack_160 = auVar272._24_4_ + fStack_160;
    fStack_15c = auVar272._28_4_ + auVar200._28_4_;
    auVar44._4_4_ = fVar201 * fStack_174;
    auVar44._0_4_ = fVar239 * local_178;
    auVar44._8_4_ = fVar240 * fStack_170;
    auVar44._12_4_ = fVar207 * fStack_16c;
    auVar44._16_4_ = fVar241 * fStack_168;
    auVar44._20_4_ = fVar202 * fStack_164;
    auVar44._24_4_ = fVar242 * fStack_160;
    auVar44._28_4_ = auVar272._28_4_ + auVar200._28_4_;
    auVar45._4_4_ = fStack_154 * fVar243;
    auVar45._0_4_ = local_158 * fVar203;
    auVar45._8_4_ = fStack_150 * fVar204;
    auVar45._12_4_ = fStack_14c * fVar218;
    auVar45._16_4_ = fStack_148 * fVar219;
    auVar45._20_4_ = fStack_144 * fVar220;
    auVar45._24_4_ = fStack_140 * fVar222;
    auVar45._28_4_ = fStack_13c;
    auVar26 = vsubps_avx(auVar44,auVar45);
    auVar46._4_4_ = fVar201 * local_b8._4_4_;
    auVar46._0_4_ = fVar239 * local_b8._0_4_;
    auVar46._8_4_ = fVar240 * local_b8._8_4_;
    auVar46._12_4_ = fVar207 * local_b8._12_4_;
    auVar46._16_4_ = fVar241 * local_b8._16_4_;
    auVar46._20_4_ = fVar202 * local_b8._20_4_;
    auVar46._24_4_ = fVar242 * local_b8._24_4_;
    auVar46._28_4_ = fStack_13c;
    auVar47._4_4_ = fVar243 * fStack_4e4;
    auVar47._0_4_ = fVar203 * local_4e8;
    auVar47._8_4_ = fVar204 * fStack_4e0;
    auVar47._12_4_ = fVar218 * fStack_4dc;
    auVar47._16_4_ = fVar219 * fStack_4d8;
    auVar47._20_4_ = fVar220 * fStack_4d4;
    auVar47._24_4_ = fVar222 * fStack_4d0;
    auVar47._28_4_ = local_b8._28_4_;
    auVar127 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = fVar201 * auVar25._4_4_;
    auVar48._0_4_ = fVar239 * auVar25._0_4_;
    auVar48._8_4_ = fVar240 * auVar25._8_4_;
    auVar48._12_4_ = fVar207 * auVar25._12_4_;
    auVar48._16_4_ = fVar241 * auVar25._16_4_;
    auVar48._20_4_ = fVar202 * auVar25._20_4_;
    auVar48._24_4_ = fVar242 * auVar25._24_4_;
    auVar48._28_4_ = auVar29._28_4_ + auVar28._28_4_;
    auVar49._4_4_ = auVar24._4_4_ * fVar243;
    auVar49._0_4_ = auVar24._0_4_ * fVar203;
    auVar49._8_4_ = auVar24._8_4_ * fVar204;
    auVar49._12_4_ = auVar24._12_4_ * fVar218;
    auVar49._16_4_ = auVar24._16_4_ * fVar219;
    auVar49._20_4_ = auVar24._20_4_ * fVar220;
    auVar49._24_4_ = auVar24._24_4_ * fVar222;
    auVar49._28_4_ = auVar95._28_4_ + auVar21._28_4_;
    auVar28 = vsubps_avx(auVar48,auVar49);
    auVar19 = vminps_avx(auVar96,auVar22);
    auVar94 = vmaxps_avx(auVar96,auVar22);
    auVar20 = vminps_avx(auVar97,auVar125);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar97,auVar125);
    auVar94 = vmaxps_avx(auVar94,auVar19);
    auVar21 = vminps_avx(auVar126,auVar26);
    auVar19 = vmaxps_avx(auVar126,auVar26);
    auVar22 = vminps_avx(auVar127,auVar28);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar22 = vminps_avx(auVar20,auVar22);
    auVar20 = vmaxps_avx(auVar127,auVar28);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar94,auVar19);
    auVar94 = vcmpps_avx(auVar22,local_78,2);
    auVar19 = vcmpps_avx(auVar19,local_98,5);
    auVar94 = vandps_avx(auVar19,auVar94);
    auVar19 = local_198 & auVar94;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(auVar23,local_d8);
      auVar20 = vsubps_avx(auVar24,auVar238);
      fVar201 = auVar19._0_4_ + auVar20._0_4_;
      fVar240 = auVar19._4_4_ + auVar20._4_4_;
      fVar207 = auVar19._8_4_ + auVar20._8_4_;
      fVar241 = auVar19._12_4_ + auVar20._12_4_;
      fVar202 = auVar19._16_4_ + auVar20._16_4_;
      fVar242 = auVar19._20_4_ + auVar20._20_4_;
      fVar203 = auVar19._24_4_ + auVar20._24_4_;
      auVar22 = vsubps_avx(local_f8,auVar168);
      auVar26 = vsubps_avx(auVar25,auVar272);
      fVar243 = auVar22._0_4_ + auVar26._0_4_;
      fVar204 = auVar22._4_4_ + auVar26._4_4_;
      fVar218 = auVar22._8_4_ + auVar26._8_4_;
      fVar219 = auVar22._12_4_ + auVar26._12_4_;
      fVar220 = auVar22._16_4_ + auVar26._16_4_;
      fVar222 = auVar22._20_4_ + auVar26._20_4_;
      fVar223 = auVar22._24_4_ + auVar26._24_4_;
      fVar239 = auVar26._28_4_;
      auVar50._4_4_ = auVar168._4_4_ * fVar240;
      auVar50._0_4_ = auVar168._0_4_ * fVar201;
      auVar50._8_4_ = auVar168._8_4_ * fVar207;
      auVar50._12_4_ = auVar168._12_4_ * fVar241;
      auVar50._16_4_ = auVar168._16_4_ * fVar202;
      auVar50._20_4_ = auVar168._20_4_ * fVar242;
      auVar50._24_4_ = auVar168._24_4_ * fVar203;
      auVar50._28_4_ = auVar168._28_4_;
      auVar51._4_4_ = local_d8._4_4_ * fVar204;
      auVar51._0_4_ = local_d8._0_4_ * fVar243;
      auVar51._8_4_ = local_d8._8_4_ * fVar218;
      auVar51._12_4_ = local_d8._12_4_ * fVar219;
      auVar51._16_4_ = local_d8._16_4_ * fVar220;
      auVar51._20_4_ = local_d8._20_4_ * fVar222;
      auVar51._24_4_ = local_d8._24_4_ * fVar223;
      auVar51._28_4_ = local_d8._28_4_;
      auVar26 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = fVar240 * fStack_134;
      auVar52._0_4_ = fVar201 * local_138;
      auVar52._8_4_ = fVar207 * fStack_130;
      auVar52._12_4_ = fVar241 * fStack_12c;
      auVar52._16_4_ = fVar202 * fStack_128;
      auVar52._20_4_ = fVar242 * fStack_124;
      auVar52._24_4_ = fVar203 * fStack_120;
      auVar52._28_4_ = auVar168._28_4_;
      auVar53._4_4_ = fVar204 * fStack_114;
      auVar53._0_4_ = fVar243 * local_118;
      auVar53._8_4_ = fVar218 * fStack_110;
      auVar53._12_4_ = fVar219 * fStack_10c;
      auVar53._16_4_ = fVar220 * fStack_108;
      auVar53._20_4_ = fVar222 * fStack_104;
      auVar53._24_4_ = fVar223 * fStack_100;
      auVar53._28_4_ = fVar239;
      auVar28 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fVar240 * (float)local_5c8._4_4_;
      auVar54._0_4_ = fVar201 * (float)local_5c8._0_4_;
      auVar54._8_4_ = fVar207 * fStack_5c0;
      auVar54._12_4_ = fVar241 * fStack_5bc;
      auVar54._16_4_ = fVar202 * fStack_5b8;
      auVar54._20_4_ = fVar242 * fStack_5b4;
      auVar54._24_4_ = fVar203 * fStack_5b0;
      auVar54._28_4_ = fVar239;
      auVar55._4_4_ = fVar204 * (float)local_5a8._4_4_;
      auVar55._0_4_ = fVar243 * (float)local_5a8._0_4_;
      auVar55._8_4_ = fVar218 * fStack_5a0;
      auVar55._12_4_ = fVar219 * fStack_59c;
      auVar55._16_4_ = fVar220 * fStack_598;
      auVar55._20_4_ = fVar222 * fStack_594;
      auVar55._24_4_ = fVar223 * fStack_590;
      auVar55._28_4_ = auVar21._28_4_;
      auVar29 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = local_f8._4_4_ * fVar240;
      auVar56._0_4_ = local_f8._0_4_ * fVar201;
      auVar56._8_4_ = local_f8._8_4_ * fVar207;
      auVar56._12_4_ = local_f8._12_4_ * fVar241;
      auVar56._16_4_ = local_f8._16_4_ * fVar202;
      auVar56._20_4_ = local_f8._20_4_ * fVar242;
      auVar56._24_4_ = local_f8._24_4_ * fVar203;
      auVar56._28_4_ = auVar21._28_4_;
      auVar57._4_4_ = auVar23._4_4_ * fVar204;
      auVar57._0_4_ = auVar23._0_4_ * fVar243;
      auVar57._8_4_ = auVar23._8_4_ * fVar218;
      auVar57._12_4_ = auVar23._12_4_ * fVar219;
      auVar57._16_4_ = auVar23._16_4_ * fVar220;
      auVar57._20_4_ = auVar23._20_4_ * fVar222;
      uVar2 = auVar23._28_4_;
      auVar57._24_4_ = auVar23._24_4_ * fVar223;
      auVar57._28_4_ = uVar2;
      auVar23 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = auVar272._4_4_ * fVar240;
      auVar58._0_4_ = auVar272._0_4_ * fVar201;
      auVar58._8_4_ = auVar272._8_4_ * fVar207;
      auVar58._12_4_ = auVar272._12_4_ * fVar241;
      auVar58._16_4_ = auVar272._16_4_ * fVar202;
      auVar58._20_4_ = auVar272._20_4_ * fVar242;
      auVar58._24_4_ = auVar272._24_4_ * fVar203;
      auVar58._28_4_ = uVar2;
      auVar59._4_4_ = auVar238._4_4_ * fVar204;
      auVar59._0_4_ = auVar238._0_4_ * fVar243;
      auVar59._8_4_ = auVar238._8_4_ * fVar218;
      auVar59._12_4_ = auVar238._12_4_ * fVar219;
      auVar59._16_4_ = auVar238._16_4_ * fVar220;
      auVar59._20_4_ = auVar238._20_4_ * fVar222;
      auVar59._24_4_ = auVar238._24_4_ * fVar223;
      auVar59._28_4_ = auVar238._28_4_;
      auVar95 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = fVar240 * fStack_174;
      auVar60._0_4_ = fVar201 * local_178;
      auVar60._8_4_ = fVar207 * fStack_170;
      auVar60._12_4_ = fVar241 * fStack_16c;
      auVar60._16_4_ = fVar202 * fStack_168;
      auVar60._20_4_ = fVar242 * fStack_164;
      auVar60._24_4_ = fVar203 * fStack_160;
      auVar60._28_4_ = uVar2;
      auVar61._4_4_ = fVar204 * fStack_154;
      auVar61._0_4_ = fVar243 * local_158;
      auVar61._8_4_ = fVar218 * fStack_150;
      auVar61._12_4_ = fVar219 * fStack_14c;
      auVar61._16_4_ = fVar220 * fStack_148;
      auVar61._20_4_ = fVar222 * fStack_144;
      auVar61._24_4_ = fVar223 * fStack_140;
      auVar61._28_4_ = auVar272._28_4_;
      auVar96 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = fVar240 * local_b8._4_4_;
      auVar62._0_4_ = fVar201 * local_b8._0_4_;
      auVar62._8_4_ = fVar207 * local_b8._8_4_;
      auVar62._12_4_ = fVar241 * local_b8._12_4_;
      auVar62._16_4_ = fVar202 * local_b8._16_4_;
      auVar62._20_4_ = fVar242 * local_b8._20_4_;
      auVar62._24_4_ = fVar203 * local_b8._24_4_;
      auVar62._28_4_ = auVar272._28_4_;
      auVar63._4_4_ = fStack_4e4 * fVar204;
      auVar63._0_4_ = local_4e8 * fVar243;
      auVar63._8_4_ = fStack_4e0 * fVar218;
      auVar63._12_4_ = fStack_4dc * fVar219;
      auVar63._16_4_ = fStack_4d8 * fVar220;
      auVar63._20_4_ = fStack_4d4 * fVar222;
      auVar63._24_4_ = fStack_4d0 * fVar223;
      auVar63._28_4_ = local_f8._28_4_;
      auVar97 = vsubps_avx(auVar62,auVar63);
      auVar64._4_4_ = fVar240 * auVar25._4_4_;
      auVar64._0_4_ = fVar201 * auVar25._0_4_;
      auVar64._8_4_ = fVar207 * auVar25._8_4_;
      auVar64._12_4_ = fVar241 * auVar25._12_4_;
      auVar64._16_4_ = fVar202 * auVar25._16_4_;
      auVar64._20_4_ = fVar242 * auVar25._20_4_;
      auVar64._24_4_ = fVar203 * auVar25._24_4_;
      auVar64._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar65._4_4_ = auVar24._4_4_ * fVar204;
      auVar65._0_4_ = auVar24._0_4_ * fVar243;
      auVar65._8_4_ = auVar24._8_4_ * fVar218;
      auVar65._12_4_ = auVar24._12_4_ * fVar219;
      auVar65._16_4_ = auVar24._16_4_ * fVar220;
      auVar65._20_4_ = auVar24._20_4_ * fVar222;
      auVar65._24_4_ = auVar24._24_4_ * fVar223;
      auVar65._28_4_ = auVar22._28_4_ + fVar239;
      auVar24 = vsubps_avx(auVar64,auVar65);
      auVar20 = vminps_avx(auVar26,auVar28);
      auVar19 = vmaxps_avx(auVar26,auVar28);
      auVar21 = vminps_avx(auVar29,auVar23);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar29,auVar23);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar22 = vminps_avx(auVar95,auVar96);
      auVar20 = vmaxps_avx(auVar95,auVar96);
      auVar23 = vminps_avx(auVar97,auVar24);
      auVar22 = vminps_avx(auVar22,auVar23);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar97,auVar24);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vcmpps_avx(auVar22,local_78,2);
      auVar20 = vcmpps_avx(auVar20,local_98,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar94 = vandps_avx(local_198,auVar94);
      auVar20 = auVar94 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar19,auVar94);
        uVar70 = vmovmskps_avx(auVar94);
        if (uVar70 != 0) {
          mask_stack[uVar74] = uVar70 & 0xff;
          BVar3 = (BBox1f)vmovlps_avx(auVar227);
          cu_stack[uVar74] = BVar3;
          BVar3 = (BBox1f)vmovlps_avx(auVar226);
          cv_stack[uVar74] = BVar3;
          uVar74 = (ulong)((int)uVar74 + 1);
        }
      }
    }
LAB_009c6cde:
    do {
      do {
        do {
          do {
            if ((int)uVar74 == 0) {
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar103._4_4_ = uVar2;
              auVar103._0_4_ = uVar2;
              auVar103._8_4_ = uVar2;
              auVar103._12_4_ = uVar2;
              auVar103._16_4_ = uVar2;
              auVar103._20_4_ = uVar2;
              auVar103._24_4_ = uVar2;
              auVar103._28_4_ = uVar2;
              auVar94 = vcmpps_avx(local_1b8,auVar103,2);
              uVar69 = vmovmskps_avx(auVar94);
              uVar69 = (uint)uVar73 & uVar69;
              context = pRVar68;
              goto LAB_009c5df4;
            }
            uVar72 = (int)uVar74 - 1;
            uVar70 = mask_stack[uVar72];
            fVar239 = cu_stack[uVar72].lower;
            fVar201 = cu_stack[uVar72].upper;
            auVar321._8_8_ = 0;
            auVar321._0_4_ = cv_stack[uVar72].lower;
            auVar321._4_4_ = cv_stack[uVar72].upper;
            auVar326 = ZEXT1664(auVar321);
            uVar18 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            mask_stack[uVar72] = uVar70;
            if (uVar70 == 0) {
              uVar74 = (ulong)uVar72;
            }
            fVar207 = (float)(uVar18 + 1) * 0.14285715;
            fVar240 = (1.0 - (float)uVar18 * 0.14285715) * fVar239 +
                      fVar201 * (float)uVar18 * 0.14285715;
            fVar239 = (1.0 - fVar207) * fVar239 + fVar201 * fVar207;
            fVar201 = fVar239 - fVar240;
            if (0.16666667 <= fVar201) {
              auVar82 = vinsertps_avx(ZEXT416((uint)fVar240),ZEXT416((uint)fVar239),0x10);
              auVar331 = ZEXT1664(auVar82);
              goto LAB_009c6678;
            }
            auVar82 = vshufps_avx(auVar321,auVar321,0x50);
            auVar108._8_4_ = 0x3f800000;
            auVar108._0_8_ = 0x3f8000003f800000;
            auVar108._12_4_ = 0x3f800000;
            auVar190 = vsubps_avx(auVar108,auVar82);
            fVar207 = auVar82._0_4_;
            fVar241 = auVar82._4_4_;
            fVar202 = auVar82._8_4_;
            fVar242 = auVar82._12_4_;
            fVar203 = auVar190._0_4_;
            fVar243 = auVar190._4_4_;
            fVar204 = auVar190._8_4_;
            fVar218 = auVar190._12_4_;
            auVar137._0_4_ = auVar301._0_4_ * fVar207 + fVar203 * fVar244;
            auVar137._4_4_ = auVar301._4_4_ * fVar241 + fVar243 * fVar208;
            auVar137._8_4_ = auVar301._0_4_ * fVar202 + fVar204 * fVar244;
            auVar137._12_4_ = auVar301._4_4_ * fVar242 + fVar218 * fVar208;
            auVar173._0_4_ = auVar265._0_4_ * fVar207 + fVar203 * fVar205;
            auVar173._4_4_ = auVar265._4_4_ * fVar241 + fVar243 * fVar217;
            auVar173._8_4_ = auVar265._0_4_ * fVar202 + fVar204 * fVar205;
            auVar173._12_4_ = auVar265._4_4_ * fVar242 + fVar218 * fVar217;
            auVar191._0_4_ = auVar107._0_4_ * fVar207 + auVar327._0_4_ * fVar203;
            auVar191._4_4_ = auVar107._4_4_ * fVar241 + auVar327._4_4_ * fVar243;
            auVar191._8_4_ = auVar107._0_4_ * fVar202 + auVar327._0_4_ * fVar204;
            auVar191._12_4_ = auVar107._4_4_ * fVar242 + auVar327._4_4_ * fVar218;
            auVar79._0_4_ = auVar77._0_4_ * fVar207 + auVar314._0_4_ * fVar203;
            auVar79._4_4_ = auVar77._4_4_ * fVar241 + auVar314._4_4_ * fVar243;
            auVar79._8_4_ = auVar77._0_4_ * fVar202 + auVar314._0_4_ * fVar204;
            auVar79._12_4_ = auVar77._4_4_ * fVar242 + auVar314._4_4_ * fVar218;
            auVar130._16_16_ = auVar137;
            auVar130._0_16_ = auVar137;
            auVar157._16_16_ = auVar173;
            auVar157._0_16_ = auVar173;
            auVar187._16_16_ = auVar191;
            auVar187._0_16_ = auVar191;
            auVar94 = ZEXT2032(CONCAT416(fVar239,ZEXT416((uint)fVar240)));
            auVar94 = vshufps_avx(auVar94,auVar94,0);
            auVar19 = vsubps_avx(auVar157,auVar130);
            fVar207 = auVar94._0_4_;
            fVar241 = auVar94._4_4_;
            fVar202 = auVar94._8_4_;
            fVar242 = auVar94._12_4_;
            fVar203 = auVar94._16_4_;
            fVar243 = auVar94._20_4_;
            fVar204 = auVar94._24_4_;
            auVar131._0_4_ = auVar137._0_4_ + auVar19._0_4_ * fVar207;
            auVar131._4_4_ = auVar137._4_4_ + auVar19._4_4_ * fVar241;
            auVar131._8_4_ = auVar137._8_4_ + auVar19._8_4_ * fVar202;
            auVar131._12_4_ = auVar137._12_4_ + auVar19._12_4_ * fVar242;
            auVar131._16_4_ = auVar137._0_4_ + auVar19._16_4_ * fVar203;
            auVar131._20_4_ = auVar137._4_4_ + auVar19._20_4_ * fVar243;
            auVar131._24_4_ = auVar137._8_4_ + auVar19._24_4_ * fVar204;
            auVar131._28_4_ = auVar137._12_4_ + auVar19._28_4_;
            auVar94 = vsubps_avx(auVar187,auVar157);
            auVar158._0_4_ = auVar173._0_4_ + auVar94._0_4_ * fVar207;
            auVar158._4_4_ = auVar173._4_4_ + auVar94._4_4_ * fVar241;
            auVar158._8_4_ = auVar173._8_4_ + auVar94._8_4_ * fVar202;
            auVar158._12_4_ = auVar173._12_4_ + auVar94._12_4_ * fVar242;
            auVar158._16_4_ = auVar173._0_4_ + auVar94._16_4_ * fVar203;
            auVar158._20_4_ = auVar173._4_4_ + auVar94._20_4_ * fVar243;
            auVar158._24_4_ = auVar173._8_4_ + auVar94._24_4_ * fVar204;
            auVar158._28_4_ = auVar173._12_4_ + auVar94._28_4_;
            auVar82 = vsubps_avx(auVar79,auVar191);
            auVar101._0_4_ = auVar191._0_4_ + auVar82._0_4_ * fVar207;
            auVar101._4_4_ = auVar191._4_4_ + auVar82._4_4_ * fVar241;
            auVar101._8_4_ = auVar191._8_4_ + auVar82._8_4_ * fVar202;
            auVar101._12_4_ = auVar191._12_4_ + auVar82._12_4_ * fVar242;
            auVar101._16_4_ = auVar191._0_4_ + auVar82._0_4_ * fVar203;
            auVar101._20_4_ = auVar191._4_4_ + auVar82._4_4_ * fVar243;
            auVar101._24_4_ = auVar191._8_4_ + auVar82._8_4_ * fVar204;
            auVar101._28_4_ = auVar191._12_4_ + auVar82._12_4_;
            auVar94 = vsubps_avx(auVar158,auVar131);
            auVar132._0_4_ = auVar131._0_4_ + fVar207 * auVar94._0_4_;
            auVar132._4_4_ = auVar131._4_4_ + fVar241 * auVar94._4_4_;
            auVar132._8_4_ = auVar131._8_4_ + fVar202 * auVar94._8_4_;
            auVar132._12_4_ = auVar131._12_4_ + fVar242 * auVar94._12_4_;
            auVar132._16_4_ = auVar131._16_4_ + fVar203 * auVar94._16_4_;
            auVar132._20_4_ = auVar131._20_4_ + fVar243 * auVar94._20_4_;
            auVar132._24_4_ = auVar131._24_4_ + fVar204 * auVar94._24_4_;
            auVar132._28_4_ = auVar131._28_4_ + auVar94._28_4_;
            auVar94 = vsubps_avx(auVar101,auVar158);
            auVar102._0_4_ = auVar158._0_4_ + fVar207 * auVar94._0_4_;
            auVar102._4_4_ = auVar158._4_4_ + fVar241 * auVar94._4_4_;
            auVar102._8_4_ = auVar158._8_4_ + fVar202 * auVar94._8_4_;
            auVar102._12_4_ = auVar158._12_4_ + fVar242 * auVar94._12_4_;
            auVar102._16_4_ = auVar158._16_4_ + fVar203 * auVar94._16_4_;
            auVar102._20_4_ = auVar158._20_4_ + fVar243 * auVar94._20_4_;
            auVar102._24_4_ = auVar158._24_4_ + fVar204 * auVar94._24_4_;
            auVar102._28_4_ = auVar158._28_4_ + auVar94._28_4_;
            auVar94 = vsubps_avx(auVar102,auVar132);
            auVar212._0_4_ = auVar132._0_4_ + fVar207 * auVar94._0_4_;
            auVar212._4_4_ = auVar132._4_4_ + fVar241 * auVar94._4_4_;
            auVar212._8_4_ = auVar132._8_4_ + fVar202 * auVar94._8_4_;
            auVar212._12_4_ = auVar132._12_4_ + fVar242 * auVar94._12_4_;
            auVar216._16_4_ = auVar132._16_4_ + fVar203 * auVar94._16_4_;
            auVar216._0_16_ = auVar212;
            auVar216._20_4_ = auVar132._20_4_ + fVar243 * auVar94._20_4_;
            auVar216._24_4_ = auVar132._24_4_ + fVar204 * auVar94._24_4_;
            auVar216._28_4_ = auVar132._28_4_ + auVar158._28_4_;
            auVar221 = auVar216._16_16_;
            auVar110 = vshufps_avx(ZEXT416((uint)(fVar201 * 0.33333334)),
                                   ZEXT416((uint)(fVar201 * 0.33333334)),0);
            auVar174._0_4_ = auVar212._0_4_ + auVar110._0_4_ * auVar94._0_4_ * 3.0;
            auVar174._4_4_ = auVar212._4_4_ + auVar110._4_4_ * auVar94._4_4_ * 3.0;
            auVar174._8_4_ = auVar212._8_4_ + auVar110._8_4_ * auVar94._8_4_ * 3.0;
            auVar174._12_4_ = auVar212._12_4_ + auVar110._12_4_ * auVar94._12_4_ * 3.0;
            auVar153 = vshufpd_avx(auVar212,auVar212,3);
            auVar122 = vshufpd_avx(auVar221,auVar221,3);
            auVar82 = vsubps_avx(auVar153,auVar212);
            auVar190 = vsubps_avx(auVar122,auVar221);
            auVar80._0_4_ = auVar82._0_4_ + auVar190._0_4_;
            auVar80._4_4_ = auVar82._4_4_ + auVar190._4_4_;
            auVar80._8_4_ = auVar82._8_4_ + auVar190._8_4_;
            auVar80._12_4_ = auVar82._12_4_ + auVar190._12_4_;
            auVar82 = vmovshdup_avx(auVar212);
            auVar190 = vmovshdup_avx(auVar174);
            auVar139 = vshufps_avx(auVar80,auVar80,0);
            auVar111 = vshufps_avx(auVar80,auVar80,0x55);
            fVar207 = auVar111._0_4_;
            fVar241 = auVar111._4_4_;
            fVar202 = auVar111._8_4_;
            fVar242 = auVar111._12_4_;
            fVar203 = auVar139._0_4_;
            fVar243 = auVar139._4_4_;
            fVar204 = auVar139._8_4_;
            fVar218 = auVar139._12_4_;
            auVar81._0_4_ = fVar203 * auVar212._0_4_ + auVar82._0_4_ * fVar207;
            auVar81._4_4_ = fVar243 * auVar212._4_4_ + auVar82._4_4_ * fVar241;
            auVar81._8_4_ = fVar204 * auVar212._8_4_ + auVar82._8_4_ * fVar202;
            auVar81._12_4_ = fVar218 * auVar212._12_4_ + auVar82._12_4_ * fVar242;
            auVar291._0_4_ = fVar203 * auVar174._0_4_ + auVar190._0_4_ * fVar207;
            auVar291._4_4_ = fVar243 * auVar174._4_4_ + auVar190._4_4_ * fVar241;
            auVar291._8_4_ = fVar204 * auVar174._8_4_ + auVar190._8_4_ * fVar202;
            auVar291._12_4_ = fVar218 * auVar174._12_4_ + auVar190._12_4_ * fVar242;
            auVar190 = vshufps_avx(auVar81,auVar81,0xe8);
            auVar139 = vshufps_avx(auVar291,auVar291,0xe8);
            auVar82 = vcmpps_avx(auVar190,auVar139,1);
            uVar70 = vextractps_avx(auVar82,0);
            auVar111 = auVar291;
            if ((uVar70 & 1) == 0) {
              auVar111 = auVar81;
            }
            auVar109._0_4_ = auVar110._0_4_ * auVar94._16_4_ * 3.0;
            auVar109._4_4_ = auVar110._4_4_ * auVar94._20_4_ * 3.0;
            auVar109._8_4_ = auVar110._8_4_ * auVar94._24_4_ * 3.0;
            auVar109._12_4_ = auVar110._12_4_ * 0.0;
            auVar225 = vsubps_avx(auVar221,auVar109);
            auVar110 = vmovshdup_avx(auVar225);
            auVar221 = vmovshdup_avx(auVar221);
            fVar219 = auVar225._0_4_;
            fVar220 = auVar225._4_4_;
            auVar192._0_4_ = fVar219 * fVar203 + auVar110._0_4_ * fVar207;
            auVar192._4_4_ = fVar220 * fVar243 + auVar110._4_4_ * fVar241;
            auVar192._8_4_ = auVar225._8_4_ * fVar204 + auVar110._8_4_ * fVar202;
            auVar192._12_4_ = auVar225._12_4_ * fVar218 + auVar110._12_4_ * fVar242;
            auVar328._0_4_ = fVar203 * auVar216._16_4_ + auVar221._0_4_ * fVar207;
            auVar328._4_4_ = fVar243 * auVar216._20_4_ + auVar221._4_4_ * fVar241;
            auVar328._8_4_ = fVar204 * auVar216._24_4_ + auVar221._8_4_ * fVar202;
            auVar328._12_4_ = fVar218 * auVar216._28_4_ + auVar221._12_4_ * fVar242;
            auVar221 = vshufps_avx(auVar192,auVar192,0xe8);
            auVar211 = vshufps_avx(auVar328,auVar328,0xe8);
            auVar110 = vcmpps_avx(auVar221,auVar211,1);
            uVar70 = vextractps_avx(auVar110,0);
            auVar226 = auVar328;
            if ((uVar70 & 1) == 0) {
              auVar226 = auVar192;
            }
            auVar111 = vmaxss_avx(auVar226,auVar111);
            auVar190 = vminps_avx(auVar190,auVar139);
            auVar139 = vminps_avx(auVar221,auVar211);
            auVar139 = vminps_avx(auVar190,auVar139);
            auVar82 = vshufps_avx(auVar82,auVar82,0x55);
            auVar82 = vblendps_avx(auVar82,auVar110,2);
            auVar110 = vpslld_avx(auVar82,0x1f);
            auVar82 = vshufpd_avx(auVar291,auVar291,1);
            auVar82 = vinsertps_avx(auVar82,auVar328,0x9c);
            auVar190 = vshufpd_avx(auVar81,auVar81,1);
            auVar190 = vinsertps_avx(auVar190,auVar192,0x9c);
            auVar82 = vblendvps_avx(auVar190,auVar82,auVar110);
            auVar190 = vmovshdup_avx(auVar82);
            auVar82 = vmaxss_avx(auVar190,auVar82);
            fVar202 = auVar139._0_4_;
            auVar190 = vmovshdup_avx(auVar139);
            fVar241 = auVar82._0_4_;
            fVar242 = auVar190._0_4_;
            fVar207 = auVar111._0_4_;
            if ((fVar202 < 0.0001) && (-0.0001 < fVar241)) break;
            if ((fVar242 < 0.0001 && -0.0001 < fVar207) || (fVar202 < 0.0001 && -0.0001 < fVar207))
            break;
            auVar110 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar82,1);
            auVar190 = vcmpps_avx(auVar190,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar190 = vandps_avx(auVar190,auVar110);
          } while ((auVar190 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar110 = vcmpps_avx(auVar139,_DAT_01f45a50,1);
          auVar190 = vcmpss_avx(auVar111,ZEXT416(0) << 0x20,1);
          auVar138._8_4_ = 0x3f800000;
          auVar138._0_8_ = 0x3f8000003f800000;
          auVar138._12_4_ = 0x3f800000;
          auVar175._8_4_ = 0xbf800000;
          auVar175._0_8_ = 0xbf800000bf800000;
          auVar175._12_4_ = 0xbf800000;
          auVar190 = vblendvps_avx(auVar138,auVar175,auVar190);
          auVar110 = vblendvps_avx(auVar138,auVar175,auVar110);
          auVar139 = vcmpss_avx(auVar110,auVar190,4);
          auVar139 = vpshufd_avx(ZEXT416(auVar139._0_4_ & 1),0x50);
          auVar139 = vpslld_avx(auVar139,0x1f);
          auVar139 = vpsrad_avx(auVar139,0x1f);
          auVar139 = vpandn_avx(auVar139,_DAT_01f7afb0);
          auVar111 = vmovshdup_avx(auVar110);
          fVar203 = auVar111._0_4_;
          if ((auVar110._0_4_ != fVar203) || (NAN(auVar110._0_4_) || NAN(fVar203))) {
            if ((fVar242 != fVar202) || (NAN(fVar242) || NAN(fVar202))) {
              fVar202 = -fVar202 / (fVar242 - fVar202);
              auVar110 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar202) * 0.0 + fVar202)));
            }
            else {
              auVar110 = ZEXT816(0x3f80000000000000);
              if ((fVar202 != 0.0) || (NAN(fVar202))) {
                auVar110 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar221 = vcmpps_avx(auVar139,auVar110,1);
            auVar111 = vblendps_avx(auVar139,auVar110,2);
            auVar110 = vblendps_avx(auVar110,auVar139,2);
            auVar139 = vblendvps_avx(auVar110,auVar111,auVar221);
          }
          auVar82 = vcmpss_avx(auVar82,ZEXT416(0) << 0x20,1);
          auVar140._8_4_ = 0x3f800000;
          auVar140._0_8_ = 0x3f8000003f800000;
          auVar140._12_4_ = 0x3f800000;
          auVar176._8_4_ = 0xbf800000;
          auVar176._0_8_ = 0xbf800000bf800000;
          auVar176._12_4_ = 0xbf800000;
          auVar82 = vblendvps_avx(auVar140,auVar176,auVar82);
          fVar202 = auVar82._0_4_;
          if ((auVar190._0_4_ != fVar202) || (NAN(auVar190._0_4_) || NAN(fVar202))) {
            if ((fVar241 != fVar207) || (NAN(fVar241) || NAN(fVar207))) {
              fVar207 = -fVar207 / (fVar241 - fVar207);
              auVar82 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar207) * 0.0 + fVar207)));
            }
            else {
              auVar82 = ZEXT816(0x3f80000000000000);
              if ((fVar207 != 0.0) || (NAN(fVar207))) {
                auVar82 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar110 = vcmpps_avx(auVar139,auVar82,1);
            auVar190 = vblendps_avx(auVar139,auVar82,2);
            auVar82 = vblendps_avx(auVar82,auVar139,2);
            auVar139 = vblendvps_avx(auVar82,auVar190,auVar110);
          }
          if ((fVar203 != fVar202) || (NAN(fVar203) || NAN(fVar202))) {
            auVar83._8_4_ = 0x3f800000;
            auVar83._0_8_ = 0x3f8000003f800000;
            auVar83._12_4_ = 0x3f800000;
            auVar82 = vcmpps_avx(auVar139,auVar83,1);
            auVar190 = vinsertps_avx(auVar139,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar141._4_12_ = auVar139._4_12_;
            auVar141._0_4_ = 0x3f800000;
            auVar139 = vblendvps_avx(auVar141,auVar190,auVar82);
          }
          auVar82 = vcmpps_avx(auVar139,_DAT_01f46740,1);
          auVar67._12_4_ = 0;
          auVar67._0_12_ = auVar139._4_12_;
          auVar190 = vinsertps_avx(auVar139,ZEXT416(0x3f800000),0x10);
          auVar82 = vblendvps_avx(auVar190,auVar67 << 0x20,auVar82);
          auVar190 = vmovshdup_avx(auVar82);
        } while (auVar190._0_4_ < auVar82._0_4_);
        auVar84._0_4_ = auVar82._0_4_ + -0.1;
        auVar84._4_4_ = auVar82._4_4_ + 0.1;
        auVar84._8_4_ = auVar82._8_4_ + 0.0;
        auVar84._12_4_ = auVar82._12_4_ + 0.0;
        auVar110 = vshufpd_avx(auVar174,auVar174,3);
        auVar213._8_8_ = 0x3f80000000000000;
        auVar213._0_8_ = 0x3f80000000000000;
        auVar82 = vcmpps_avx(auVar84,auVar213,1);
        auVar66._12_4_ = 0;
        auVar66._0_12_ = auVar84._4_12_;
        auVar190 = vinsertps_avx(auVar84,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar82 = vblendvps_avx(auVar190,auVar66 << 0x20,auVar82);
        auVar190 = vshufpd_avx(auVar225,auVar225,3);
        auVar139 = vshufps_avx(auVar82,auVar82,0x50);
        auVar322._8_4_ = 0x3f800000;
        auVar322._0_8_ = 0x3f8000003f800000;
        auVar322._12_4_ = 0x3f800000;
        auVar111 = vsubps_avx(auVar322,auVar139);
        local_3e8 = auVar153._0_4_;
        fStack_3e4 = auVar153._4_4_;
        fStack_3e0 = auVar153._8_4_;
        fStack_3dc = auVar153._12_4_;
        fVar207 = auVar139._0_4_;
        fVar241 = auVar139._4_4_;
        fVar202 = auVar139._8_4_;
        fVar242 = auVar139._12_4_;
        local_588 = auVar122._0_4_;
        fStack_584 = auVar122._4_4_;
        fStack_580 = auVar122._8_4_;
        fStack_57c = auVar122._12_4_;
        fVar203 = auVar111._0_4_;
        fVar243 = auVar111._4_4_;
        fVar204 = auVar111._8_4_;
        fVar218 = auVar111._12_4_;
        auVar85._0_4_ = fVar207 * local_3e8 + fVar203 * auVar212._0_4_;
        auVar85._4_4_ = fVar241 * fStack_3e4 + fVar243 * auVar212._4_4_;
        auVar85._8_4_ = fVar202 * fStack_3e0 + fVar204 * auVar212._0_4_;
        auVar85._12_4_ = fVar242 * fStack_3dc + fVar218 * auVar212._4_4_;
        auVar193._0_4_ = auVar110._0_4_ * fVar207 + fVar203 * auVar174._0_4_;
        auVar193._4_4_ = auVar110._4_4_ * fVar241 + fVar243 * auVar174._4_4_;
        auVar193._8_4_ = auVar110._8_4_ * fVar202 + fVar204 * auVar174._0_4_;
        auVar193._12_4_ = auVar110._12_4_ * fVar242 + fVar218 * auVar174._4_4_;
        auVar232._0_4_ = auVar190._0_4_ * fVar207 + fVar203 * fVar219;
        auVar232._4_4_ = auVar190._4_4_ * fVar241 + fVar243 * fVar220;
        auVar232._8_4_ = auVar190._8_4_ * fVar202 + fVar204 * fVar219;
        auVar232._12_4_ = auVar190._12_4_ * fVar242 + fVar218 * fVar220;
        auVar281._0_4_ = fVar207 * local_588 + fVar203 * auVar216._16_4_;
        auVar281._4_4_ = fVar241 * fStack_584 + fVar243 * auVar216._20_4_;
        auVar281._8_4_ = fVar202 * fStack_580 + fVar204 * auVar216._16_4_;
        auVar281._12_4_ = fVar242 * fStack_57c + fVar218 * auVar216._20_4_;
        auVar122 = vsubps_avx(auVar322,auVar82);
        auVar190 = vmovshdup_avx(auVar321);
        auVar153 = vmovsldup_avx(auVar321);
        auVar329._0_4_ = auVar122._0_4_ * auVar153._0_4_ + auVar82._0_4_ * auVar190._0_4_;
        auVar329._4_4_ = auVar122._4_4_ * auVar153._4_4_ + auVar82._4_4_ * auVar190._4_4_;
        auVar329._8_4_ = auVar122._8_4_ * auVar153._8_4_ + auVar82._8_4_ * auVar190._8_4_;
        auVar329._12_4_ = auVar122._12_4_ * auVar153._12_4_ + auVar82._12_4_ * auVar190._12_4_;
        auVar225 = vmovshdup_avx(auVar329);
        auVar82 = vsubps_avx(auVar193,auVar85);
        auVar142._0_4_ = auVar82._0_4_ * 3.0;
        auVar142._4_4_ = auVar82._4_4_ * 3.0;
        auVar142._8_4_ = auVar82._8_4_ * 3.0;
        auVar142._12_4_ = auVar82._12_4_ * 3.0;
        auVar82 = vsubps_avx(auVar232,auVar193);
        auVar161._0_4_ = auVar82._0_4_ * 3.0;
        auVar161._4_4_ = auVar82._4_4_ * 3.0;
        auVar161._8_4_ = auVar82._8_4_ * 3.0;
        auVar161._12_4_ = auVar82._12_4_ * 3.0;
        auVar82 = vsubps_avx(auVar281,auVar232);
        auVar249._0_4_ = auVar82._0_4_ * 3.0;
        auVar249._4_4_ = auVar82._4_4_ * 3.0;
        auVar249._8_4_ = auVar82._8_4_ * 3.0;
        auVar249._12_4_ = auVar82._12_4_ * 3.0;
        auVar190 = vminps_avx(auVar161,auVar249);
        auVar82 = vmaxps_avx(auVar161,auVar249);
        auVar190 = vminps_avx(auVar142,auVar190);
        auVar82 = vmaxps_avx(auVar142,auVar82);
        auVar153 = vshufpd_avx(auVar190,auVar190,3);
        auVar122 = vshufpd_avx(auVar82,auVar82,3);
        auVar190 = vminps_avx(auVar190,auVar153);
        auVar82 = vmaxps_avx(auVar82,auVar122);
        auVar153 = vshufps_avx(ZEXT416((uint)(1.0 / fVar201)),ZEXT416((uint)(1.0 / fVar201)),0);
        auVar250._0_4_ = auVar153._0_4_ * auVar190._0_4_;
        auVar250._4_4_ = auVar153._4_4_ * auVar190._4_4_;
        auVar250._8_4_ = auVar153._8_4_ * auVar190._8_4_;
        auVar250._12_4_ = auVar153._12_4_ * auVar190._12_4_;
        auVar266._0_4_ = auVar153._0_4_ * auVar82._0_4_;
        auVar266._4_4_ = auVar153._4_4_ * auVar82._4_4_;
        auVar266._8_4_ = auVar153._8_4_ * auVar82._8_4_;
        auVar266._12_4_ = auVar153._12_4_ * auVar82._12_4_;
        auVar111 = ZEXT416((uint)(1.0 / (auVar225._0_4_ - auVar329._0_4_)));
        auVar82 = vshufpd_avx(auVar85,auVar85,3);
        auVar190 = vshufpd_avx(auVar193,auVar193,3);
        auVar153 = vshufpd_avx(auVar232,auVar232,3);
        auVar122 = vshufpd_avx(auVar281,auVar281,3);
        auVar82 = vsubps_avx(auVar82,auVar85);
        auVar110 = vsubps_avx(auVar190,auVar193);
        auVar139 = vsubps_avx(auVar153,auVar232);
        auVar122 = vsubps_avx(auVar122,auVar281);
        auVar190 = vminps_avx(auVar82,auVar110);
        auVar82 = vmaxps_avx(auVar82,auVar110);
        auVar153 = vminps_avx(auVar139,auVar122);
        auVar153 = vminps_avx(auVar190,auVar153);
        auVar190 = vmaxps_avx(auVar139,auVar122);
        auVar82 = vmaxps_avx(auVar82,auVar190);
        auVar190 = vshufps_avx(auVar111,auVar111,0);
        auVar315._0_4_ = auVar190._0_4_ * auVar153._0_4_;
        auVar315._4_4_ = auVar190._4_4_ * auVar153._4_4_;
        auVar315._8_4_ = auVar190._8_4_ * auVar153._8_4_;
        auVar315._12_4_ = auVar190._12_4_ * auVar153._12_4_;
        auVar323._0_4_ = auVar190._0_4_ * auVar82._0_4_;
        auVar323._4_4_ = auVar190._4_4_ * auVar82._4_4_;
        auVar323._8_4_ = auVar190._8_4_ * auVar82._8_4_;
        auVar323._12_4_ = auVar190._12_4_ * auVar82._12_4_;
        auVar82 = vmovsldup_avx(auVar329);
        auVar282._4_12_ = auVar82._4_12_;
        auVar282._0_4_ = fVar240;
        auVar292._4_12_ = auVar329._4_12_;
        auVar292._0_4_ = fVar239;
        auVar162._0_4_ = (fVar240 + fVar239) * 0.5;
        auVar162._4_4_ = (auVar82._4_4_ + auVar329._4_4_) * 0.5;
        auVar162._8_4_ = (auVar82._8_4_ + auVar329._8_4_) * 0.5;
        auVar162._12_4_ = (auVar82._12_4_ + auVar329._12_4_) * 0.5;
        auVar82 = vshufps_avx(auVar162,auVar162,0);
        local_278 = auVar27._0_4_;
        fStack_274 = auVar27._4_4_;
        fStack_270 = auVar27._8_4_;
        fStack_26c = auVar27._12_4_;
        fVar207 = auVar82._0_4_;
        fVar241 = auVar82._4_4_;
        fVar202 = auVar82._8_4_;
        fVar242 = auVar82._12_4_;
        p00.field_0.i[0] = auVar4._0_4_;
        p00.field_0.i[1] = auVar4._4_4_;
        p00.field_0.i[2] = auVar4._8_4_;
        p00.field_0.i[3] = auVar4._12_4_;
        auVar112._0_4_ = fVar207 * local_278 + p00.field_0.v[0];
        auVar112._4_4_ = fVar241 * fStack_274 + p00.field_0.v[1];
        auVar112._8_4_ = fVar202 * fStack_270 + p00.field_0.v[2];
        auVar112._12_4_ = fVar242 * fStack_26c + p00.field_0.v[3];
        local_288 = auVar209._0_4_;
        fStack_284 = auVar209._4_4_;
        fStack_280 = auVar209._8_4_;
        fStack_27c = auVar209._12_4_;
        p01.field_0.i[0] = auVar290._0_4_;
        p01.field_0.i[1] = auVar290._4_4_;
        p01.field_0.i[2] = auVar290._8_4_;
        p01.field_0.i[3] = auVar290._12_4_;
        auVar143._0_4_ = fVar207 * local_288 + p01.field_0.v[0];
        auVar143._4_4_ = fVar241 * fStack_284 + p01.field_0.v[1];
        auVar143._8_4_ = fVar202 * fStack_280 + p01.field_0.v[2];
        auVar143._12_4_ = fVar242 * fStack_27c + p01.field_0.v[3];
        local_298 = auVar78._0_4_;
        fStack_294 = auVar78._4_4_;
        fStack_290 = auVar78._8_4_;
        fStack_28c = auVar78._12_4_;
        p02.field_0.i[0] = auVar5._0_4_;
        p02.field_0.i[1] = auVar5._4_4_;
        p02.field_0.i[2] = auVar5._8_4_;
        p02.field_0.i[3] = auVar5._12_4_;
        auVar194._0_4_ = fVar207 * local_298 + p02.field_0.v[0];
        auVar194._4_4_ = fVar241 * fStack_294 + p02.field_0.v[1];
        auVar194._8_4_ = fVar202 * fStack_290 + p02.field_0.v[2];
        auVar194._12_4_ = fVar242 * fStack_28c + p02.field_0.v[3];
        auVar82 = vsubps_avx(auVar143,auVar112);
        auVar113._0_4_ = auVar112._0_4_ + fVar207 * auVar82._0_4_;
        auVar113._4_4_ = auVar112._4_4_ + fVar241 * auVar82._4_4_;
        auVar113._8_4_ = auVar112._8_4_ + fVar202 * auVar82._8_4_;
        auVar113._12_4_ = auVar112._12_4_ + fVar242 * auVar82._12_4_;
        auVar82 = vsubps_avx(auVar194,auVar143);
        auVar144._0_4_ = auVar143._0_4_ + fVar207 * auVar82._0_4_;
        auVar144._4_4_ = auVar143._4_4_ + fVar241 * auVar82._4_4_;
        auVar144._8_4_ = auVar143._8_4_ + fVar202 * auVar82._8_4_;
        auVar144._12_4_ = auVar143._12_4_ + fVar242 * auVar82._12_4_;
        auVar82 = vsubps_avx(auVar144,auVar113);
        fVar207 = auVar113._0_4_ + fVar207 * auVar82._0_4_;
        fVar241 = auVar113._4_4_ + fVar241 * auVar82._4_4_;
        auVar86._0_8_ = CONCAT44(fVar241,fVar207);
        auVar86._8_4_ = auVar113._8_4_ + fVar202 * auVar82._8_4_;
        auVar86._12_4_ = auVar113._12_4_ + fVar242 * auVar82._12_4_;
        fVar202 = auVar82._0_4_ * 3.0;
        fVar242 = auVar82._4_4_ * 3.0;
        auVar114._0_8_ = CONCAT44(fVar242,fVar202);
        auVar114._8_4_ = auVar82._8_4_ * 3.0;
        auVar114._12_4_ = auVar82._12_4_ * 3.0;
        auVar145._8_8_ = auVar86._0_8_;
        auVar145._0_8_ = auVar86._0_8_;
        auVar82 = vshufpd_avx(auVar86,auVar86,3);
        auVar190 = vshufps_avx(auVar162,auVar162,0x55);
        auVar139 = vsubps_avx(auVar82,auVar145);
        auVar302._0_4_ = auVar139._0_4_ * auVar190._0_4_ + fVar207;
        auVar302._4_4_ = auVar139._4_4_ * auVar190._4_4_ + fVar241;
        auVar302._8_4_ = auVar139._8_4_ * auVar190._8_4_ + fVar207;
        auVar302._12_4_ = auVar139._12_4_ * auVar190._12_4_ + fVar241;
        auVar146._8_8_ = auVar114._0_8_;
        auVar146._0_8_ = auVar114._0_8_;
        auVar82 = vshufpd_avx(auVar114,auVar114,1);
        auVar82 = vsubps_avx(auVar82,auVar146);
        auVar115._0_4_ = auVar82._0_4_ * auVar190._0_4_ + fVar202;
        auVar115._4_4_ = auVar82._4_4_ * auVar190._4_4_ + fVar242;
        auVar115._8_4_ = auVar82._8_4_ * auVar190._8_4_ + fVar202;
        auVar115._12_4_ = auVar82._12_4_ * auVar190._12_4_ + fVar242;
        auVar190 = vmovshdup_avx(auVar115);
        auVar195._0_8_ = auVar190._0_8_ ^ 0x8000000080000000;
        auVar195._8_4_ = auVar190._8_4_ ^ 0x80000000;
        auVar195._12_4_ = auVar190._12_4_ ^ 0x80000000;
        auVar153 = vmovshdup_avx(auVar139);
        auVar82 = vunpcklps_avx(auVar153,auVar195);
        auVar122 = vshufps_avx(auVar82,auVar195,4);
        auVar87._0_8_ = auVar139._0_8_ ^ 0x8000000080000000;
        auVar87._8_4_ = -auVar139._8_4_;
        auVar87._12_4_ = -auVar139._12_4_;
        auVar82 = vmovlhps_avx(auVar87,auVar115);
        auVar110 = vshufps_avx(auVar82,auVar115,8);
        auVar82 = ZEXT416((uint)(auVar115._0_4_ * auVar153._0_4_ - auVar139._0_4_ * auVar190._0_4_))
        ;
        auVar190 = vshufps_avx(auVar82,auVar82,0);
        auVar82 = vdivps_avx(auVar122,auVar190);
        auVar190 = vdivps_avx(auVar110,auVar190);
        auVar110 = vinsertps_avx(auVar250,auVar315,0x1c);
        auVar139 = vinsertps_avx(auVar266,auVar323,0x1c);
        auVar111 = vinsertps_avx(auVar315,auVar250,0x4c);
        auVar221 = vinsertps_avx(auVar323,auVar266,0x4c);
        auVar153 = vmovsldup_avx(auVar82);
        auVar147._0_4_ = auVar153._0_4_ * auVar110._0_4_;
        auVar147._4_4_ = auVar153._4_4_ * auVar110._4_4_;
        auVar147._8_4_ = auVar153._8_4_ * auVar110._8_4_;
        auVar147._12_4_ = auVar153._12_4_ * auVar110._12_4_;
        auVar116._0_4_ = auVar139._0_4_ * auVar153._0_4_;
        auVar116._4_4_ = auVar139._4_4_ * auVar153._4_4_;
        auVar116._8_4_ = auVar139._8_4_ * auVar153._8_4_;
        auVar116._12_4_ = auVar139._12_4_ * auVar153._12_4_;
        auVar122 = vminps_avx(auVar147,auVar116);
        auVar153 = vmaxps_avx(auVar116,auVar147);
        auVar211 = vmovsldup_avx(auVar190);
        auVar324._0_4_ = auVar111._0_4_ * auVar211._0_4_;
        auVar324._4_4_ = auVar111._4_4_ * auVar211._4_4_;
        auVar324._8_4_ = auVar111._8_4_ * auVar211._8_4_;
        auVar324._12_4_ = auVar111._12_4_ * auVar211._12_4_;
        auVar148._0_4_ = auVar221._0_4_ * auVar211._0_4_;
        auVar148._4_4_ = auVar221._4_4_ * auVar211._4_4_;
        auVar148._8_4_ = auVar221._8_4_ * auVar211._8_4_;
        auVar148._12_4_ = auVar221._12_4_ * auVar211._12_4_;
        auVar211 = vminps_avx(auVar324,auVar148);
        auVar177._0_4_ = auVar122._0_4_ + auVar211._0_4_;
        auVar177._4_4_ = auVar122._4_4_ + auVar211._4_4_;
        auVar177._8_4_ = auVar122._8_4_ + auVar211._8_4_;
        auVar177._12_4_ = auVar122._12_4_ + auVar211._12_4_;
        auVar122 = vmaxps_avx(auVar148,auVar324);
        auVar211 = vsubps_avx(auVar282,auVar162);
        auVar226 = vsubps_avx(auVar292,auVar162);
        auVar117._0_4_ = auVar153._0_4_ + auVar122._0_4_;
        auVar117._4_4_ = auVar153._4_4_ + auVar122._4_4_;
        auVar117._8_4_ = auVar153._8_4_ + auVar122._8_4_;
        auVar117._12_4_ = auVar153._12_4_ + auVar122._12_4_;
        auVar149._8_8_ = 0x3f800000;
        auVar149._0_8_ = 0x3f800000;
        auVar153 = vsubps_avx(auVar149,auVar117);
        auVar122 = vsubps_avx(auVar149,auVar177);
        fVar204 = auVar211._0_4_;
        auVar178._0_4_ = fVar204 * auVar153._0_4_;
        fVar218 = auVar211._4_4_;
        auVar178._4_4_ = fVar218 * auVar153._4_4_;
        fVar219 = auVar211._8_4_;
        auVar178._8_4_ = fVar219 * auVar153._8_4_;
        fVar220 = auVar211._12_4_;
        auVar178._12_4_ = fVar220 * auVar153._12_4_;
        fVar202 = auVar226._0_4_;
        auVar118._0_4_ = fVar202 * auVar153._0_4_;
        fVar242 = auVar226._4_4_;
        auVar118._4_4_ = fVar242 * auVar153._4_4_;
        fVar203 = auVar226._8_4_;
        auVar118._8_4_ = fVar203 * auVar153._8_4_;
        fVar243 = auVar226._12_4_;
        auVar118._12_4_ = fVar243 * auVar153._12_4_;
        auVar293._0_4_ = fVar204 * auVar122._0_4_;
        auVar293._4_4_ = fVar218 * auVar122._4_4_;
        auVar293._8_4_ = fVar219 * auVar122._8_4_;
        auVar293._12_4_ = fVar220 * auVar122._12_4_;
        auVar150._0_4_ = fVar202 * auVar122._0_4_;
        auVar150._4_4_ = fVar242 * auVar122._4_4_;
        auVar150._8_4_ = fVar203 * auVar122._8_4_;
        auVar150._12_4_ = fVar243 * auVar122._12_4_;
        auVar153 = vminps_avx(auVar178,auVar293);
        auVar122 = vminps_avx(auVar118,auVar150);
        auVar211 = vminps_avx(auVar153,auVar122);
        auVar153 = vmaxps_avx(auVar293,auVar178);
        auVar122 = vmaxps_avx(auVar150,auVar118);
        auVar226 = vshufps_avx(auVar162,auVar162,0x54);
        auVar122 = vmaxps_avx(auVar122,auVar153);
        auVar227 = vshufps_avx(auVar302,auVar302,0);
        auVar228 = vshufps_avx(auVar302,auVar302,0x55);
        auVar153 = vhaddps_avx(auVar211,auVar211);
        auVar122 = vhaddps_avx(auVar122,auVar122);
        auVar163._0_4_ = auVar227._0_4_ * auVar82._0_4_ + auVar228._0_4_ * auVar190._0_4_;
        auVar163._4_4_ = auVar227._4_4_ * auVar82._4_4_ + auVar228._4_4_ * auVar190._4_4_;
        auVar163._8_4_ = auVar227._8_4_ * auVar82._8_4_ + auVar228._8_4_ * auVar190._8_4_;
        auVar163._12_4_ = auVar227._12_4_ * auVar82._12_4_ + auVar228._12_4_ * auVar190._12_4_;
        auVar211 = vsubps_avx(auVar226,auVar163);
        fVar207 = auVar211._0_4_ + auVar153._0_4_;
        fVar241 = auVar211._0_4_ + auVar122._0_4_;
        auVar153 = vmaxss_avx(ZEXT416((uint)fVar240),ZEXT416((uint)fVar207));
        auVar122 = vminss_avx(ZEXT416((uint)fVar241),ZEXT416((uint)fVar239));
      } while (auVar122._0_4_ < auVar153._0_4_);
      auVar153 = vmovshdup_avx(auVar82);
      auVar88._0_4_ = auVar153._0_4_ * auVar110._0_4_;
      auVar88._4_4_ = auVar153._4_4_ * auVar110._4_4_;
      auVar88._8_4_ = auVar153._8_4_ * auVar110._8_4_;
      auVar88._12_4_ = auVar153._12_4_ * auVar110._12_4_;
      auVar119._0_4_ = auVar139._0_4_ * auVar153._0_4_;
      auVar119._4_4_ = auVar139._4_4_ * auVar153._4_4_;
      auVar119._8_4_ = auVar139._8_4_ * auVar153._8_4_;
      auVar119._12_4_ = auVar139._12_4_ * auVar153._12_4_;
      auVar122 = vminps_avx(auVar88,auVar119);
      auVar153 = vmaxps_avx(auVar119,auVar88);
      auVar110 = vmovshdup_avx(auVar190);
      auVar179._0_4_ = auVar111._0_4_ * auVar110._0_4_;
      auVar179._4_4_ = auVar111._4_4_ * auVar110._4_4_;
      auVar179._8_4_ = auVar111._8_4_ * auVar110._8_4_;
      auVar179._12_4_ = auVar111._12_4_ * auVar110._12_4_;
      auVar120._0_4_ = auVar221._0_4_ * auVar110._0_4_;
      auVar120._4_4_ = auVar221._4_4_ * auVar110._4_4_;
      auVar120._8_4_ = auVar221._8_4_ * auVar110._8_4_;
      auVar120._12_4_ = auVar221._12_4_ * auVar110._12_4_;
      auVar110 = vminps_avx(auVar179,auVar120);
      auVar151._0_4_ = auVar122._0_4_ + auVar110._0_4_;
      auVar151._4_4_ = auVar122._4_4_ + auVar110._4_4_;
      auVar151._8_4_ = auVar122._8_4_ + auVar110._8_4_;
      auVar151._12_4_ = auVar122._12_4_ + auVar110._12_4_;
      auVar122 = vmaxps_avx(auVar120,auVar179);
      auVar89._0_4_ = auVar153._0_4_ + auVar122._0_4_;
      auVar89._4_4_ = auVar153._4_4_ + auVar122._4_4_;
      auVar89._8_4_ = auVar153._8_4_ + auVar122._8_4_;
      auVar89._12_4_ = auVar153._12_4_ + auVar122._12_4_;
      auVar153 = vsubps_avx(auVar213,auVar89);
      auVar122 = vsubps_avx(auVar213,auVar151);
      auVar152._0_4_ = fVar204 * auVar153._0_4_;
      auVar152._4_4_ = fVar218 * auVar153._4_4_;
      auVar152._8_4_ = fVar219 * auVar153._8_4_;
      auVar152._12_4_ = fVar220 * auVar153._12_4_;
      auVar180._0_4_ = fVar204 * auVar122._0_4_;
      auVar180._4_4_ = fVar218 * auVar122._4_4_;
      auVar180._8_4_ = fVar219 * auVar122._8_4_;
      auVar180._12_4_ = fVar220 * auVar122._12_4_;
      auVar90._0_4_ = fVar202 * auVar153._0_4_;
      auVar90._4_4_ = fVar242 * auVar153._4_4_;
      auVar90._8_4_ = fVar203 * auVar153._8_4_;
      auVar90._12_4_ = fVar243 * auVar153._12_4_;
      auVar121._0_4_ = fVar202 * auVar122._0_4_;
      auVar121._4_4_ = fVar242 * auVar122._4_4_;
      auVar121._8_4_ = fVar203 * auVar122._8_4_;
      auVar121._12_4_ = fVar243 * auVar122._12_4_;
      auVar153 = vminps_avx(auVar152,auVar180);
      auVar122 = vminps_avx(auVar90,auVar121);
      auVar153 = vminps_avx(auVar153,auVar122);
      auVar122 = vmaxps_avx(auVar180,auVar152);
      auVar110 = vmaxps_avx(auVar121,auVar90);
      auVar153 = vhaddps_avx(auVar153,auVar153);
      auVar122 = vmaxps_avx(auVar110,auVar122);
      auVar122 = vhaddps_avx(auVar122,auVar122);
      auVar110 = vmovshdup_avx(auVar211);
      auVar139 = ZEXT416((uint)(auVar110._0_4_ + auVar153._0_4_));
      auVar153 = vmaxss_avx(auVar329,auVar139);
      auVar110 = ZEXT416((uint)(auVar110._0_4_ + auVar122._0_4_));
      auVar122 = vminss_avx(auVar110,auVar225);
    } while (auVar122._0_4_ < auVar153._0_4_);
    uVar70 = 0;
    if ((fVar240 < fVar207) && (fVar241 < fVar239)) {
      auVar153 = vcmpps_avx(auVar110,auVar225,1);
      auVar122 = vcmpps_avx(auVar329,auVar139,1);
      auVar153 = vandps_avx(auVar122,auVar153);
      uVar70 = auVar153._0_4_;
    }
    auVar251._8_4_ = 0x7fffffff;
    auVar251._0_8_ = 0x7fffffff7fffffff;
    auVar251._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar6._0_4_;
    p03.field_0.i[1] = auVar6._4_4_;
    p03.field_0.i[2] = auVar6._8_4_;
    p03.field_0.i[3] = auVar6._12_4_;
    if ((3 < (uint)uVar74 || fVar201 < 0.001) || (uVar70 & 1) != 0) {
      lVar71 = 0xc9;
      do {
        lVar71 = lVar71 + -1;
        if (lVar71 == 0) goto LAB_009c6cde;
        fVar201 = auVar211._0_4_;
        fVar239 = 1.0 - fVar201;
        auVar153 = ZEXT416((uint)(fVar239 * fVar239 * fVar239));
        auVar153 = vshufps_avx(auVar153,auVar153,0);
        auVar122 = ZEXT416((uint)(fVar201 * 3.0 * fVar239 * fVar239));
        auVar122 = vshufps_avx(auVar122,auVar122,0);
        auVar110 = ZEXT416((uint)(fVar239 * fVar201 * fVar201 * 3.0));
        auVar110 = vshufps_avx(auVar110,auVar110,0);
        auVar139 = ZEXT416((uint)(fVar201 * fVar201 * fVar201));
        auVar139 = vshufps_avx(auVar139,auVar139,0);
        fVar239 = p00.field_0.v[0] * auVar153._0_4_ +
                  p01.field_0.v[0] * auVar122._0_4_ +
                  p03.field_0.v[0] * auVar139._0_4_ + p02.field_0.v[0] * auVar110._0_4_;
        fVar201 = p00.field_0.v[1] * auVar153._4_4_ +
                  p01.field_0.v[1] * auVar122._4_4_ +
                  p03.field_0.v[1] * auVar139._4_4_ + p02.field_0.v[1] * auVar110._4_4_;
        auVar91._0_8_ = CONCAT44(fVar201,fVar239);
        auVar91._8_4_ =
             p00.field_0.v[2] * auVar153._8_4_ +
             p01.field_0.v[2] * auVar122._8_4_ +
             p03.field_0.v[2] * auVar139._8_4_ + p02.field_0.v[2] * auVar110._8_4_;
        auVar91._12_4_ =
             p00.field_0.v[3] * auVar153._12_4_ +
             p01.field_0.v[3] * auVar122._12_4_ +
             p03.field_0.v[3] * auVar139._12_4_ + p02.field_0.v[3] * auVar110._12_4_;
        auVar123._8_8_ = auVar91._0_8_;
        auVar123._0_8_ = auVar91._0_8_;
        auVar122 = vshufpd_avx(auVar91,auVar91,1);
        auVar153 = vmovshdup_avx(auVar211);
        auVar122 = vsubps_avx(auVar122,auVar123);
        auVar92._0_4_ = auVar153._0_4_ * auVar122._0_4_ + fVar239;
        auVar92._4_4_ = auVar153._4_4_ * auVar122._4_4_ + fVar201;
        auVar92._8_4_ = auVar153._8_4_ * auVar122._8_4_ + fVar239;
        auVar92._12_4_ = auVar153._12_4_ * auVar122._12_4_ + fVar201;
        auVar153 = vshufps_avx(auVar92,auVar92,0);
        auVar122 = vshufps_avx(auVar92,auVar92,0x55);
        auVar124._0_4_ = auVar82._0_4_ * auVar153._0_4_ + auVar190._0_4_ * auVar122._0_4_;
        auVar124._4_4_ = auVar82._4_4_ * auVar153._4_4_ + auVar190._4_4_ * auVar122._4_4_;
        auVar124._8_4_ = auVar82._8_4_ * auVar153._8_4_ + auVar190._8_4_ * auVar122._8_4_;
        auVar124._12_4_ = auVar82._12_4_ * auVar153._12_4_ + auVar190._12_4_ * auVar122._12_4_;
        auVar211 = vsubps_avx(auVar211,auVar124);
        auVar153 = vandps_avx(auVar251,auVar92);
        auVar122 = vshufps_avx(auVar153,auVar153,0xf5);
        auVar153 = vmaxss_avx(auVar122,auVar153);
      } while (fVar188 <= auVar153._0_4_);
      fVar239 = auVar211._0_4_;
      if ((0.0 <= fVar239) && (fVar239 <= 1.0)) {
        auVar82 = vmovshdup_avx(auVar211);
        fVar201 = auVar82._0_4_;
        if ((0.0 <= fVar201) && (fVar201 <= 1.0)) {
          auVar82 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar221 = vinsertps_avx(auVar82,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28)
          ;
          auVar82 = vdpps_avx(auVar221,auVar8,0x7f);
          auVar190 = vdpps_avx(auVar221,auVar9,0x7f);
          auVar153 = vdpps_avx(auVar221,auVar75,0x7f);
          auVar122 = vdpps_avx(auVar221,auVar104,0x7f);
          auVar110 = vdpps_avx(auVar221,auVar105,0x7f);
          auVar139 = vdpps_avx(auVar221,auVar133,0x7f);
          auVar111 = vdpps_avx(auVar221,auVar170,0x7f);
          auVar221 = vdpps_avx(auVar221,auVar189,0x7f);
          fVar242 = 1.0 - fVar201;
          fVar203 = 1.0 - fVar239;
          fVar240 = auVar211._4_4_;
          fVar207 = auVar211._8_4_;
          fVar241 = auVar211._12_4_;
          fVar202 = fVar203 * fVar239 * fVar239 * 3.0;
          auVar233._0_4_ = fVar239 * fVar239 * fVar239;
          auVar233._4_4_ = fVar240 * fVar240 * fVar240;
          auVar233._8_4_ = fVar207 * fVar207 * fVar207;
          auVar233._12_4_ = fVar241 * fVar241 * fVar241;
          fVar207 = fVar203 * fVar203 * fVar239 * 3.0;
          fVar241 = fVar203 * fVar203 * fVar203;
          fVar240 = fVar241 * (fVar242 * auVar82._0_4_ + fVar201 * auVar110._0_4_) +
                    (fVar242 * auVar190._0_4_ + auVar139._0_4_ * fVar201) * fVar207 +
                    fVar202 * (auVar111._0_4_ * fVar201 + fVar242 * auVar153._0_4_) +
                    auVar233._0_4_ * (fVar242 * auVar122._0_4_ + fVar201 * auVar221._0_4_);
          auVar82 = ZEXT416((uint)fVar240);
          if (((fVar224 <= fVar240) &&
              (fVar242 = *(float *)(ray + k * 4 + 0x80), fVar240 <= fVar242)) &&
             (pGVar13 = (pRVar68->scene->geometries).items[uVar69].ptr,
             (pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
            local_208 = vshufps_avx(auVar211,auVar211,0x55);
            auVar267._8_4_ = 0x3f800000;
            auVar267._0_8_ = 0x3f8000003f800000;
            auVar267._12_4_ = 0x3f800000;
            auVar190 = vsubps_avx(auVar267,local_208);
            fVar243 = local_208._0_4_;
            fVar204 = local_208._4_4_;
            fVar218 = local_208._8_4_;
            fVar219 = local_208._12_4_;
            local_358 = auVar159._0_4_;
            fStack_354 = auVar159._4_4_;
            fStack_350 = auVar159._8_4_;
            fStack_34c = auVar159._12_4_;
            fVar220 = auVar190._0_4_;
            fVar222 = auVar190._4_4_;
            fVar223 = auVar190._8_4_;
            fVar169 = auVar190._12_4_;
            auVar283._0_4_ = fVar243 * auVar300._0_4_ + fVar220 * auVar263._0_4_;
            auVar283._4_4_ = fVar204 * auVar300._4_4_ + fVar222 * auVar263._4_4_;
            auVar283._8_4_ = fVar218 * auVar300._8_4_ + fVar223 * auVar263._8_4_;
            auVar283._12_4_ = fVar219 * auVar300._12_4_ + fVar169 * auVar263._12_4_;
            auVar294._0_4_ = fVar243 * auVar76._0_4_ + fVar220 * auVar280._0_4_;
            auVar294._4_4_ = fVar204 * auVar76._4_4_ + fVar222 * auVar280._4_4_;
            auVar294._8_4_ = fVar218 * auVar76._8_4_ + fVar223 * auVar280._8_4_;
            auVar294._12_4_ = fVar219 * auVar76._12_4_ + fVar169 * auVar280._12_4_;
            local_448 = auVar10._0_4_;
            fStack_444 = auVar10._4_4_;
            fStack_440 = auVar10._8_4_;
            fStack_43c = auVar10._12_4_;
            auVar303._0_4_ = fVar243 * local_358 + fVar220 * local_448;
            auVar303._4_4_ = fVar204 * fStack_354 + fVar222 * fStack_444;
            auVar303._8_4_ = fVar218 * fStack_350 + fVar223 * fStack_440;
            auVar303._12_4_ = fVar219 * fStack_34c + fVar169 * fStack_43c;
            local_418 = auVar7._0_4_;
            fStack_414 = auVar7._4_4_;
            fStack_410 = auVar7._8_4_;
            fStack_40c = auVar7._12_4_;
            auVar268._0_4_ = fVar243 * auVar319._0_4_ + fVar220 * local_418;
            auVar268._4_4_ = fVar204 * auVar319._4_4_ + fVar222 * fStack_414;
            auVar268._8_4_ = fVar218 * auVar319._8_4_ + fVar223 * fStack_410;
            auVar268._12_4_ = fVar219 * auVar319._12_4_ + fVar169 * fStack_40c;
            auVar110 = vsubps_avx(auVar294,auVar283);
            auVar139 = vsubps_avx(auVar303,auVar294);
            auVar111 = vsubps_avx(auVar268,auVar303);
            local_218 = vshufps_avx(auVar211,auVar211,0);
            fVar219 = local_218._0_4_;
            fVar220 = local_218._4_4_;
            fVar222 = local_218._8_4_;
            fVar223 = local_218._12_4_;
            auVar190 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
            fVar203 = auVar190._0_4_;
            fVar243 = auVar190._4_4_;
            fVar204 = auVar190._8_4_;
            fVar218 = auVar190._12_4_;
            auVar190 = vshufps_avx(auVar233,auVar233,0);
            local_398 = auVar171._0_4_;
            fStack_394 = auVar171._4_4_;
            fStack_390 = auVar171._8_4_;
            fStack_38c = auVar171._12_4_;
            auVar153 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
            local_388 = auVar135._0_4_;
            fStack_384 = auVar135._4_4_;
            fStack_380 = auVar135._8_4_;
            fStack_37c = auVar135._12_4_;
            auVar122 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
            local_378 = auVar134._0_4_;
            fStack_374 = auVar134._4_4_;
            fStack_370 = auVar134._8_4_;
            fStack_36c = auVar134._12_4_;
            auVar214._0_4_ =
                 (fVar203 * (fVar203 * auVar110._0_4_ + fVar219 * auVar139._0_4_) +
                 fVar219 * (fVar203 * auVar139._0_4_ + fVar219 * auVar111._0_4_)) * 3.0;
            auVar214._4_4_ =
                 (fVar243 * (fVar243 * auVar110._4_4_ + fVar220 * auVar139._4_4_) +
                 fVar220 * (fVar243 * auVar139._4_4_ + fVar220 * auVar111._4_4_)) * 3.0;
            auVar214._8_4_ =
                 (fVar204 * (fVar204 * auVar110._8_4_ + fVar222 * auVar139._8_4_) +
                 fVar222 * (fVar204 * auVar139._8_4_ + fVar222 * auVar111._8_4_)) * 3.0;
            auVar214._12_4_ =
                 (fVar218 * (fVar218 * auVar110._12_4_ + fVar223 * auVar139._12_4_) +
                 fVar223 * (fVar218 * auVar139._12_4_ + fVar223 * auVar111._12_4_)) * 3.0;
            auVar110 = vshufps_avx(ZEXT416((uint)fVar241),ZEXT416((uint)fVar241),0);
            local_368 = auVar106._0_4_;
            fStack_364 = auVar106._4_4_;
            fStack_360 = auVar106._8_4_;
            fStack_35c = auVar106._12_4_;
            auVar181._0_4_ =
                 auVar110._0_4_ * local_368 +
                 auVar122._0_4_ * local_378 +
                 auVar190._0_4_ * local_398 + auVar153._0_4_ * local_388;
            auVar181._4_4_ =
                 auVar110._4_4_ * fStack_364 +
                 auVar122._4_4_ * fStack_374 +
                 auVar190._4_4_ * fStack_394 + auVar153._4_4_ * fStack_384;
            auVar181._8_4_ =
                 auVar110._8_4_ * fStack_360 +
                 auVar122._8_4_ * fStack_370 +
                 auVar190._8_4_ * fStack_390 + auVar153._8_4_ * fStack_380;
            auVar181._12_4_ =
                 auVar110._12_4_ * fStack_35c +
                 auVar122._12_4_ * fStack_36c +
                 auVar190._12_4_ * fStack_38c + auVar153._12_4_ * fStack_37c;
            auVar190 = vshufps_avx(auVar214,auVar214,0xc9);
            auVar196._0_4_ = auVar181._0_4_ * auVar190._0_4_;
            auVar196._4_4_ = auVar181._4_4_ * auVar190._4_4_;
            auVar196._8_4_ = auVar181._8_4_ * auVar190._8_4_;
            auVar196._12_4_ = auVar181._12_4_ * auVar190._12_4_;
            auVar190 = vshufps_avx(auVar181,auVar181,0xc9);
            auVar182._0_4_ = auVar214._0_4_ * auVar190._0_4_;
            auVar182._4_4_ = auVar214._4_4_ * auVar190._4_4_;
            auVar182._8_4_ = auVar214._8_4_ * auVar190._8_4_;
            auVar182._12_4_ = auVar214._12_4_ * auVar190._12_4_;
            auVar190 = vsubps_avx(auVar182,auVar196);
            if ((pRVar68->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              *(float *)(ray + k * 4 + 0x80) = fVar240;
              uVar2 = vextractps_avx(auVar190,1);
              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
              uVar2 = vextractps_avx(auVar190,2);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
              *(int *)(ray + k * 4 + 0xe0) = auVar190._0_4_;
              *(float *)(ray + k * 4 + 0xf0) = fVar239;
              *(float *)(ray + k * 4 + 0x100) = fVar201;
              *(uint *)(ray + k * 4 + 0x110) = uVar12;
              *(uint *)(ray + k * 4 + 0x120) = uVar69;
              *(uint *)(ray + k * 4 + 0x130) = pRVar68->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = pRVar68->user->instPrimID[0];
            }
            else {
              auVar153 = vshufps_avx(auVar190,auVar190,0x55);
              auVar122 = vshufps_avx(auVar190,auVar190,0xaa);
              local_228 = vshufps_avx(auVar190,auVar190,0);
              local_248[0] = (RTCHitN)auVar153[0];
              local_248[1] = (RTCHitN)auVar153[1];
              local_248[2] = (RTCHitN)auVar153[2];
              local_248[3] = (RTCHitN)auVar153[3];
              local_248[4] = (RTCHitN)auVar153[4];
              local_248[5] = (RTCHitN)auVar153[5];
              local_248[6] = (RTCHitN)auVar153[6];
              local_248[7] = (RTCHitN)auVar153[7];
              local_248[8] = (RTCHitN)auVar153[8];
              local_248[9] = (RTCHitN)auVar153[9];
              local_248[10] = (RTCHitN)auVar153[10];
              local_248[0xb] = (RTCHitN)auVar153[0xb];
              local_248[0xc] = (RTCHitN)auVar153[0xc];
              local_248[0xd] = (RTCHitN)auVar153[0xd];
              local_248[0xe] = (RTCHitN)auVar153[0xe];
              local_248[0xf] = (RTCHitN)auVar153[0xf];
              local_238 = auVar122;
              local_3b8 = auVar210._0_8_;
              uStack_3b0 = auVar210._8_8_;
              local_1f8 = local_3b8;
              uStack_1f0 = uStack_3b0;
              local_1e8 = auVar229;
              vcmpps_avx(ZEXT1632(auVar229),ZEXT1632(auVar229),0xf);
              uStack_1d4 = pRVar68->user->instID[0];
              local_1d8 = uStack_1d4;
              uStack_1d0 = uStack_1d4;
              uStack_1cc = uStack_1d4;
              uStack_1c8 = pRVar68->user->instPrimID[0];
              uStack_1c4 = uStack_1c8;
              uStack_1c0 = uStack_1c8;
              uStack_1bc = uStack_1c8;
              *(float *)(ray + k * 4 + 0x80) = fVar240;
              local_4a8 = *local_498;
              args.valid = (int *)local_4a8;
              args.geometryUserPtr = pGVar13->userPtr;
              args.context = pRVar68->user;
              args.hit = local_248;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar13->intersectionFilterN)(&args);
                auVar326._8_56_ = extraout_var;
                auVar326._0_8_ = extraout_XMM1_Qa;
                auVar82 = auVar326._0_16_;
              }
              if (local_4a8 == (undefined1  [16])0x0) {
                auVar190 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar82 = vpcmpeqd_avx(auVar82,auVar82);
                auVar190 = auVar190 ^ auVar82;
              }
              else {
                p_Var14 = pRVar68->args->filter;
                auVar82 = vpcmpeqd_avx(auVar122,auVar122);
                if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                   (((pRVar68->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var14)(&args);
                  auVar82 = vpcmpeqd_avx(auVar82,auVar82);
                }
                auVar153 = vpcmpeqd_avx(local_4a8,_DAT_01f45a50);
                auVar190 = auVar153 ^ auVar82;
                if (local_4a8 != (undefined1  [16])0x0) {
                  auVar153 = auVar153 ^ auVar82;
                  auVar82 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])args.hit);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar82;
                  auVar82 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(args.hit + 0x10));
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar82;
                  auVar82 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(args.hit + 0x20));
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar82;
                  auVar82 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(args.hit + 0x30));
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar82;
                  auVar82 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(args.hit + 0x40));
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar82;
                  auVar82 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar82;
                  auVar82 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar82;
                  auVar82 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar82;
                  auVar82 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar82;
                }
              }
              auVar93._8_8_ = 0x100000001;
              auVar93._0_8_ = 0x100000001;
              if ((auVar93 & auVar190) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar242;
              }
            }
          }
        }
      }
      goto LAB_009c6cde;
    }
    auVar82 = vinsertps_avx(ZEXT416((uint)fVar240),ZEXT416((uint)fVar239),0x10);
    auVar331 = ZEXT1664(auVar82);
    auVar326 = ZEXT1664(auVar329);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }